

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  bool reduce_c;
  int i_1;
  int iVar4;
  undefined8 in_RAX;
  Mat *pMVar5;
  Mat *pMVar6;
  ulong uVar7;
  Mat *pMVar8;
  Mat *pMVar9;
  uint uVar10;
  undefined4 uVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  void *pvVar16;
  void *pvVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  byte bVar21;
  long lVar22;
  Mat *pMVar23;
  byte bVar24;
  ulong uVar25;
  bool post_process;
  undefined1 post_process_00;
  int j_42;
  uint uVar26;
  long lVar27;
  int i_48;
  int q;
  int i_50;
  uint uVar28;
  ulong uVar29;
  float sum_2;
  float extraout_XMM0_Da;
  float fVar30;
  float extraout_XMM0_Da_00;
  float fVar31;
  undefined1 in_XMM0 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_var [12];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 extraout_var_01 [12];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 extraout_var_02 [12];
  undefined1 extraout_XMM0_05 [16];
  undefined1 extraout_XMM0_06 [16];
  undefined1 extraout_XMM0_07 [16];
  undefined1 extraout_XMM0_08 [16];
  undefined1 extraout_XMM0_09 [16];
  undefined1 extraout_XMM0_10 [16];
  undefined1 extraout_XMM0_11 [16];
  undefined1 extraout_XMM0_12 [16];
  undefined1 extraout_XMM0_13 [16];
  undefined1 extraout_XMM0_14 [16];
  undefined1 extraout_XMM0_15 [16];
  undefined1 extraout_var_03 [12];
  undefined1 extraout_XMM0_16 [16];
  undefined1 extraout_XMM0_17 [16];
  undefined1 extraout_var_04 [12];
  undefined1 extraout_XMM0_18 [16];
  float sum;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  Option *in_stack_ffffffffffffff00;
  int local_e0;
  Mat sums;
  int local_88;
  Mat local_80;
  int axes_flag [3];
  
  uVar26 = bottom_blob->dims;
  pMVar23 = (Mat *)(ulong)uVar26;
  axes_flag[2] = 0;
  axes_flag[0] = 0;
  axes_flag[1] = 0;
  if (this->reduce_all == 0) {
    pvVar16 = (this->axes).data;
    uVar10 = (this->axes).w;
    uVar25 = 0;
    uVar20 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar20 = uVar25;
    }
    for (; uVar20 != uVar25; uVar25 = uVar25 + 1) {
      iVar4 = *(int *)((long)pvVar16 + uVar25 * 4);
      axes_flag[(int)(iVar4 + (iVar4 >> 0x1f & uVar26 + 1) + -1)] = 1;
    }
    auVar46 = _DAT_00163d70;
    if (uVar26 != 1) {
      if (uVar26 == 2) {
        in_XMM0._4_4_ = axes_flag[1];
        in_XMM0._0_4_ = (float)axes_flag[0];
        in_XMM0._8_8_ = 0;
        auVar46._0_4_ = -(uint)(axes_flag[0] == 1);
        auVar46._4_4_ = -(uint)(axes_flag[1] == 1);
        auVar46._8_4_ = -(uint)(axes_flag[1] == 1);
        auVar46._12_4_ = 0xffffffff;
      }
      else {
        if (uVar26 == 3) {
          uVar11 = (undefined4)CONCAT71((int7)((ulong)pvVar16 >> 8),axes_flag[0] == 1);
          in_XMM0._4_4_ = axes_flag[2];
          in_XMM0._0_4_ = (float)axes_flag[1];
          in_XMM0._8_8_ = 0;
          auVar46._0_4_ = -(uint)(axes_flag[1] == 1);
          auVar46._4_4_ = -(uint)(axes_flag[2] == 1);
          auVar46._8_4_ = -(uint)(axes_flag[2] == 1);
          auVar46._12_4_ = 0xffffffff;
          goto LAB_00138692;
        }
        auVar46 = (undefined1  [16])0x0;
      }
    }
    uVar11 = 0;
  }
  else {
    uVar11 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    auVar46 = _DAT_00163d60;
  }
LAB_00138692:
  if (10 < (uint)this->operation) {
    return 0;
  }
  lVar22 = auVar46._0_8_;
  lVar27 = auVar46._8_8_;
  uVar10 = (uint)auVar46._8_2_;
  reduce_c = SUB41(uVar11,0);
  bVar15 = auVar46[8];
  fVar30 = in_XMM0._0_4_;
  bVar14 = auVar46[0];
  switch(this->operation) {
  case 0:
    fVar30 = this->coeff;
    iVar19 = this->keepdims;
    auVar47._0_8_ = lVar22 << 0x3f;
    auVar47._8_8_ = lVar27 << 0x3f;
    uVar11 = movmskpd((uint)auVar46._8_2_,auVar47);
    bVar15 = (byte)uVar11;
    post_process = false;
    goto LAB_001396a1;
  case 1:
    fVar30 = this->coeff;
    post_process_00 = (undefined1)this->keepdims;
    auVar51._0_8_ = lVar22 << 0x3f;
    auVar51._8_8_ = lVar27 << 0x3f;
    uVar11 = movmskpd(uVar10,auVar51);
    bVar15 = (byte)uVar11;
    goto LAB_00138869;
  case 2:
    fVar30 = this->coeff;
    pMVar23 = top_blob;
    if (this->keepdims == 0) {
      auVar54._0_8_ = lVar22 << 0x3f;
      auVar54._8_8_ = lVar27 << 0x3f;
      uVar11 = movmskpd(uVar10,auVar54);
      iVar4 = reduction_op<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                        (bottom_blob,top_blob,fVar30,(bool)((byte)uVar11 >> 1),
                         (bool)((byte)uVar11 & 1),reduce_c,opt);
    }
    else {
      auVar49._0_8_ = lVar22 << 0x3f;
      auVar49._8_8_ = lVar27 << 0x3f;
      uVar11 = movmskpd(uVar10,auVar49);
      iVar4 = reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                        (bottom_blob,top_blob,fVar30,(bool)((byte)uVar11 >> 1),
                         (bool)((byte)uVar11 & 1),reduce_c,opt);
    }
    if (iVar4 == 0) {
      if (1.1920929e-07 < ABS(fVar30 + -1.0)) {
        reduction_post_process<ncnn::post_process_identity<float>>
                  (top_blob,fVar30,(Option *)pMVar23);
        return 0;
      }
      return 0;
    }
    break;
  case 3:
    if (uVar26 == 3) {
      auVar33._0_8_ = lVar22 << 0x3f;
      auVar33._8_8_ = lVar27 << 0x3f;
      uVar26 = movmskpd(3,auVar33);
      iVar4 = 1;
      iVar19 = iVar4;
      if ((uVar26 & 2) != 0) {
        iVar19 = bottom_blob->w;
      }
      if ((uVar26 & 1) != 0) {
        iVar4 = bottom_blob->h;
      }
      iVar4 = iVar4 * iVar19;
      if (reduce_c != false) {
        iVar4 = iVar4 * bottom_blob->c;
      }
    }
    else if (uVar26 == 2) {
      auVar32._0_8_ = lVar22 << 0x3f;
      auVar32._8_8_ = lVar27 << 0x3f;
      uVar26 = movmskpd(auVar46._0_4_,auVar32);
      if ((uVar26 & 2) == 0) {
        iVar4 = 1;
      }
      else {
        iVar4 = bottom_blob->w;
      }
      if ((uVar26 & 1) != 0) {
        iVar4 = iVar4 * bottom_blob->h;
      }
    }
    else if (uVar26 == 1) {
      iVar4 = bottom_blob->w;
    }
    else {
      iVar4 = 1;
    }
    fVar30 = this->coeff / (float)iVar4;
    iVar19 = this->keepdims;
    auVar64._0_8_ = lVar22 << 0x3f;
    auVar64._8_8_ = lVar27 << 0x3f;
    uVar11 = movmskpd(iVar4,auVar64);
    bVar15 = (byte)uVar11;
    post_process = true;
LAB_001396a1:
    iVar4 = reduction<std::plus<float>,std::plus<float>,ncnn::post_process_identity<float>>
                      (bottom_blob,top_blob,fVar30,(bool)(bVar15 >> 1),(bool)(bVar15 & 1),reduce_c,
                       post_process,0.0,iVar19,opt);
    return iVar4;
  case 4:
    fVar30 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar26 == 3) {
        uVar26 = bottom_blob->w;
        lVar22 = (long)(int)uVar26;
        uVar10 = bottom_blob->h;
        uVar28 = bottom_blob->c;
        pMVar5 = (Mat *)(ulong)uVar28;
        uVar18 = uVar10 * uVar26;
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        auVar66._0_8_ = SUB168(auVar46 ^ auVar41,0) << 0x3f;
        auVar66._8_8_ = SUB168(auVar46 ^ auVar41,8) << 0x3f;
        iVar4 = movmskpd(3,auVar66);
        bVar21 = reduce_c ^ 1;
        if (iVar4 == 0 && bVar21 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pMVar23 = (Mat *)(ulong)uVar28;
          Mat::Mat(&sums,uVar28,sVar2,opt->workspace_allocator);
          local_88 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            pMVar9 = (Mat *)0x0;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar28 < 1) {
              pMVar5 = (Mat *)0x0;
            }
            for (; pMVar9 != pMVar5; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
              pMVar23 = bottom_blob;
              Mat::channel(&local_80,bottom_blob,(int)pMVar9);
              pvVar16 = local_80.data;
              Mat::~Mat(&local_80);
              fVar31 = -3.4028235e+38;
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar1 = *(float *)((long)pvVar16 + uVar20 * 4);
                if (fVar31 <= fVar1) {
                  fVar31 = fVar1;
                }
              }
              *(float *)((long)sums.data + (long)pMVar9 * 4) = fVar31;
            }
            fVar31 = -3.4028235e+38;
            for (pMVar9 = (Mat *)0x0; pMVar5 != pMVar9; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
              fVar1 = *(float *)((long)sums.data + (long)pMVar9 * 4);
              if (fVar31 <= fVar1) {
                fVar31 = fVar1;
              }
            }
            *(float *)top_blob->data = fVar31;
            local_88 = 0;
          }
          goto LAB_0013b9da;
        }
        if (iVar4 == 0 && reduce_c == false) {
          pMVar23 = pMVar5;
          Mat::create(top_blob,uVar28,sVar2,opt->blob_allocator);
          pMVar8 = (Mat *)0x0;
          pMVar9 = (Mat *)(ulong)uVar18;
          if ((int)uVar18 < 1) {
            pMVar9 = pMVar8;
          }
          if ((int)uVar28 < 1) {
            pMVar5 = pMVar8;
          }
          for (; pMVar8 != pMVar5; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            pMVar23 = bottom_blob;
            Mat::channel(&sums,bottom_blob,(int)pMVar8);
            pvVar16 = sums.data;
            Mat::~Mat(&sums);
            fVar31 = -3.4028235e+38;
            for (pMVar6 = (Mat *)0x0; pMVar9 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
              if (fVar31 <= fVar1) {
                fVar31 = fVar1;
              }
            }
            *(float *)((long)top_blob->data + (long)pMVar8 * 4) = fVar31;
          }
        }
        else {
          bVar24 = (byte)iVar4 >> 1 | bVar14;
          if (reduce_c != false || (bVar24 & 1) != 0) {
            if ((bVar24 & 1) == 0 && bVar21 == 0) {
              Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
              pMVar23 = (Mat *)0x1;
              Mat::Mat(&sums,1,uVar10,uVar28,sVar2,opt->workspace_allocator);
              local_88 = -100;
              if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
                Mat::fill(&sums,-3.4028235e+38);
                pMVar23 = (Mat *)0x0;
                uVar20 = 0;
                if (0 < (int)uVar26) {
                  uVar20 = (ulong)uVar26;
                }
                pMVar9 = (Mat *)(ulong)uVar10;
                if ((int)uVar10 < 1) {
                  pMVar9 = pMVar23;
                }
                if ((int)uVar28 < 1) {
                  pMVar5 = pMVar23;
                }
                for (; pMVar23 != pMVar5; pMVar23 = (Mat *)((long)&pMVar23->data + 1)) {
                  Mat::channel(&local_80,bottom_blob,(int)pMVar23);
                  pvVar16 = local_80.data;
                  Mat::~Mat(&local_80);
                  pvVar17 = (void *)(sums.cstep * (long)pMVar23 * sums.elemsize + (long)sums.data);
                  local_80.refcount = (int *)0x0;
                  local_80.elemsize = sums.elemsize;
                  local_80.elempack = sums.elempack;
                  local_80.allocator = sums.allocator;
                  local_80.dims = 2;
                  local_80.w = sums.w;
                  local_80.h = sums.h;
                  local_80.c = 1;
                  local_80.cstep = (size_t)(sums.h * sums.w);
                  local_80.data = pvVar17;
                  Mat::~Mat(&local_80);
                  for (pMVar8 = (Mat *)0x0; pMVar8 != pMVar9;
                      pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
                    fVar31 = -3.4028235e+38;
                    for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                      fVar1 = *(float *)((long)pvVar16 + uVar25 * 4);
                      if (fVar31 <= fVar1) {
                        fVar31 = fVar1;
                      }
                    }
                    *(float *)((long)pvVar17 + (long)pMVar8 * 4) = fVar31;
                    pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
                  }
                }
                Mat::fill(top_blob,-3.4028235e+38);
                local_88 = 0;
                pMVar23 = bottom_blob;
                for (pMVar8 = (Mat *)0x0; sVar3 = sums.cstep, sVar2 = sums.elemsize,
                    pvVar16 = sums.data, pMVar8 != pMVar5; pMVar8 = (Mat *)((long)&pMVar8->data + 1)
                    ) {
                  local_80.data =
                       (void *)(sums.cstep * (long)pMVar8 * sums.elemsize + (long)sums.data);
                  local_80.refcount = (int *)0x0;
                  local_80.elemsize = sums.elemsize;
                  local_80.elempack = sums.elempack;
                  local_80.allocator = sums.allocator;
                  local_80.dims = 2;
                  local_80.w = sums.w;
                  local_80.h = sums.h;
                  local_80.c = 1;
                  local_80.cstep = (size_t)(sums.h * sums.w);
                  pMVar23 = (Mat *)sums.allocator;
                  Mat::~Mat(&local_80);
                  pvVar17 = top_blob->data;
                  for (pMVar6 = (Mat *)0x0; pMVar9 != pMVar6;
                      pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
                    fVar31 = *(float *)((long)pvVar16 +
                                       (long)pMVar6 * 4 + sVar3 * sVar2 * (long)pMVar8);
                    fVar1 = *(float *)((long)pvVar17 + (long)pMVar6 * 4);
                    if (fVar31 <= fVar1) {
                      fVar31 = fVar1;
                    }
                    *(float *)((long)pvVar17 + (long)pMVar6 * 4) = fVar31;
                  }
                }
              }
            }
            else {
              bVar24 = (byte)iVar4 | bVar15;
              pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar24);
              if ((bVar24 & 1) != 0 || bVar21 != 0) {
                if (((bVar14 | bVar15) & 1) == 0 && bVar21 == 0) {
                  pMVar23 = (Mat *)(ulong)uVar26;
                  Mat::create(top_blob,uVar26,uVar10,sVar2,opt->blob_allocator);
                  Mat::fill(top_blob,-3.4028235e+38);
                  uVar26 = 0;
                  if ((int)uVar18 < 1) {
                    uVar18 = 0;
                  }
                  if ((int)uVar28 < 1) {
                    uVar28 = 0;
                  }
                  for (; uVar26 != uVar28; uVar26 = uVar26 + 1) {
                    pMVar23 = bottom_blob;
                    Mat::channel(&sums,bottom_blob,uVar26);
                    pvVar17 = sums.data;
                    Mat::~Mat(&sums);
                    pvVar16 = top_blob->data;
                    for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                      fVar31 = *(float *)((long)pvVar17 + uVar20 * 4);
                      fVar1 = *(float *)((long)pvVar16 + uVar20 * 4);
                      if (fVar31 <= fVar1) {
                        fVar31 = fVar1;
                      }
                      *(float *)((long)pvVar16 + uVar20 * 4) = fVar31;
                    }
                  }
                }
                else if (reduce_c == false && (bVar24 & 1) == 0) {
                  pMVar23 = (Mat *)(ulong)uVar26;
                  Mat::create(top_blob,uVar26,uVar28,sVar2,opt->blob_allocator);
                  Mat::fill(top_blob,-3.4028235e+38);
                  uVar18 = 0;
                  uVar20 = 0;
                  if (0 < (int)uVar26) {
                    uVar20 = (ulong)uVar26;
                  }
                  if ((int)uVar10 < 1) {
                    uVar10 = 0;
                  }
                  if ((int)uVar28 < 1) {
                    uVar28 = 0;
                  }
                  for (; uVar18 != uVar28; uVar18 = uVar18 + 1) {
                    pMVar23 = bottom_blob;
                    Mat::channel(&sums,bottom_blob,uVar18);
                    pvVar17 = sums.data;
                    Mat::~Mat(&sums);
                    lVar27 = (long)(int)(top_blob->w * uVar18) * top_blob->elemsize;
                    pvVar16 = top_blob->data;
                    for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                      for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                        fVar1 = *(float *)((long)pvVar17 + uVar25 * 4);
                        fVar31 = *(float *)((long)pvVar16 + uVar25 * 4 + lVar27);
                        if (fVar1 <= fVar31) {
                          fVar1 = fVar31;
                        }
                        *(float *)((long)pvVar16 + uVar25 * 4 + lVar27) = fVar1;
                      }
                      pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
                    }
                  }
                }
                goto LAB_0013b9f0;
              }
              Mat::create(top_blob,uVar26,sVar2,opt->blob_allocator);
              pMVar23 = (Mat *)(ulong)uVar26;
              Mat::Mat(&sums,uVar26,1,uVar28,sVar2,opt->workspace_allocator);
              local_88 = -100;
              if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
                Mat::fill(&sums,-3.4028235e+38);
                pMVar9 = (Mat *)0x0;
                uVar20 = 0;
                if (0 < (int)uVar26) {
                  uVar20 = (ulong)uVar26;
                }
                if ((int)uVar10 < 1) {
                  uVar10 = 0;
                }
                if ((int)uVar28 < 1) {
                  pMVar5 = pMVar9;
                }
                for (; pMVar9 != pMVar5; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
                  Mat::channel(&local_80,bottom_blob,(int)pMVar9);
                  pvVar17 = local_80.data;
                  Mat::~Mat(&local_80);
                  sVar3 = sums.cstep;
                  sVar2 = sums.elemsize;
                  pvVar16 = sums.data;
                  local_80.data =
                       (void *)(sums.cstep * (long)pMVar9 * sums.elemsize + (long)sums.data);
                  local_80.refcount = (int *)0x0;
                  local_80.elemsize = sums.elemsize;
                  local_80.elempack = sums.elempack;
                  local_80.allocator = sums.allocator;
                  local_80.dims = 2;
                  local_80.w = sums.w;
                  local_80.h = sums.h;
                  local_80.c = 1;
                  local_80.cstep = (size_t)(sums.h * sums.w);
                  pMVar23 = (Mat *)sums.allocator;
                  Mat::~Mat(&local_80);
                  lVar27 = sVar3 * sVar2 * (long)pMVar9;
                  for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                    for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                      fVar1 = *(float *)((long)pvVar17 + uVar25 * 4);
                      fVar31 = *(float *)((long)pvVar16 + uVar25 * 4 + lVar27);
                      if (fVar1 <= fVar31) {
                        fVar1 = fVar31;
                      }
                      *(float *)((long)pvVar16 + uVar25 * 4 + lVar27) = fVar1;
                    }
                    pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
                  }
                }
                Mat::fill(top_blob,-3.4028235e+38);
                local_88 = 0;
                for (pMVar9 = (Mat *)0x0; sVar3 = sums.cstep, sVar2 = sums.elemsize,
                    pvVar16 = sums.data, pMVar9 != pMVar5; pMVar9 = (Mat *)((long)&pMVar9->data + 1)
                    ) {
                  local_80.data =
                       (void *)(sums.cstep * (long)pMVar9 * sums.elemsize + (long)sums.data);
                  local_80.refcount = (int *)0x0;
                  local_80.elemsize = sums.elemsize;
                  local_80.elempack = sums.elempack;
                  local_80.allocator = sums.allocator;
                  local_80.dims = 2;
                  local_80.w = sums.w;
                  local_80.h = sums.h;
                  local_80.c = 1;
                  local_80.cstep = (size_t)(sums.h * sums.w);
                  pMVar23 = (Mat *)sums.allocator;
                  Mat::~Mat(&local_80);
                  pvVar17 = top_blob->data;
                  for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                    fVar31 = *(float *)((long)pvVar16 + uVar25 * 4 + sVar3 * sVar2 * (long)pMVar9);
                    fVar1 = *(float *)((long)pvVar17 + uVar25 * 4);
                    if (fVar31 <= fVar1) {
                      fVar31 = fVar1;
                    }
                    *(float *)((long)pvVar17 + uVar25 * 4) = fVar31;
                  }
                }
              }
            }
LAB_0013e9a3:
            Mat::~Mat(&sums);
            goto LAB_0013b9e7;
          }
          pMVar23 = (Mat *)(ulong)uVar10;
          Mat::create(top_blob,uVar10,uVar28,sVar2,opt->blob_allocator);
          uVar18 = 0;
          uVar20 = 0;
          if (0 < (int)uVar26) {
            uVar20 = (ulong)uVar26;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          for (; uVar18 != uVar28; uVar18 = uVar18 + 1) {
            pMVar23 = bottom_blob;
            Mat::channel(&sums,bottom_blob,uVar18);
            pvVar17 = sums.data;
            Mat::~Mat(&sums);
            iVar4 = top_blob->w;
            sVar2 = top_blob->elemsize;
            pvVar16 = top_blob->data;
            for (uVar25 = 0; uVar25 != uVar10; uVar25 = uVar25 + 1) {
              fVar31 = -3.4028235e+38;
              for (uVar29 = 0; uVar20 != uVar29; uVar29 = uVar29 + 1) {
                fVar1 = *(float *)((long)pvVar17 + uVar29 * 4);
                if (fVar31 <= fVar1) {
                  fVar31 = fVar1;
                }
              }
              *(float *)((long)pvVar16 + uVar25 * 4 + (long)(int)uVar18 * (long)iVar4 * sVar2) =
                   fVar31;
              pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
            }
          }
        }
      }
      else if (uVar26 == 2) {
        uVar26 = bottom_blob->w;
        pMVar5 = (Mat *)(ulong)uVar26;
        uVar10 = bottom_blob->h;
        auVar40._8_4_ = 0xffffffff;
        auVar40._0_8_ = 0xffffffffffffffff;
        auVar40._12_4_ = 0xffffffff;
        auVar65._0_8_ = SUB168(auVar46 ^ auVar40,0) << 0x3f;
        auVar65._8_8_ = SUB168(auVar46 ^ auVar40,8) << 0x3f;
        iVar4 = movmskpd(uVar11,auVar65);
        if (iVar4 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pMVar23 = (Mat *)(ulong)uVar10;
          Mat::Mat(&sums,uVar10,sVar2,opt->workspace_allocator);
          local_88 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            pMVar9 = (Mat *)0x0;
            if ((int)uVar26 < 1) {
              pMVar5 = pMVar9;
            }
            pvVar16 = bottom_blob->data;
            pMVar8 = (Mat *)(ulong)uVar10;
            if ((int)uVar10 < 1) {
              pMVar8 = pMVar9;
            }
            pMVar23 = (Mat *)((long)bottom_blob->w * bottom_blob->elemsize);
            for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
              fVar31 = -3.4028235e+38;
              for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1))
              {
                fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
                if (fVar31 <= fVar1) {
                  fVar31 = fVar1;
                }
              }
              *(float *)((long)sums.data + (long)pMVar9 * 4) = fVar31;
              pvVar16 = (void *)((long)&pMVar23->data + (long)pvVar16);
            }
            fVar31 = -3.4028235e+38;
            for (pMVar5 = (Mat *)0x0; pMVar8 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
              fVar1 = *(float *)((long)sums.data + (long)pMVar5 * 4);
              if (fVar31 <= fVar1) {
                fVar31 = fVar1;
              }
            }
            *(float *)top_blob->data = fVar31;
            local_88 = 0;
          }
          goto LAB_0013b90b;
        }
        bVar21 = (byte)iVar4 >> 1;
        pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar21);
        if (((bVar14 | bVar21) & 1) == 0) {
          Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
          pvVar16 = bottom_blob->data;
          pMVar9 = (Mat *)0x0;
          if ((int)uVar26 < 1) {
            pMVar5 = pMVar9;
          }
          iVar4 = bottom_blob->w;
          pMVar8 = (Mat *)(ulong)uVar10;
          if ((int)uVar10 < 1) {
            pMVar8 = pMVar9;
          }
          pMVar23 = (Mat *)top_blob->data;
          sVar2 = bottom_blob->elemsize;
          for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
            fVar31 = -3.4028235e+38;
            for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
              if (fVar31 <= fVar1) {
                fVar31 = fVar1;
              }
            }
            *(float *)((long)&pMVar23->data + (long)pMVar9 * 4) = fVar31;
            pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
          }
        }
        else if (((bVar15 | (byte)iVar4) & 1) == 0) {
          pMVar23 = pMVar5;
          Mat::create(top_blob,uVar26,sVar2,opt->blob_allocator);
          Mat::fill(top_blob,-3.4028235e+38);
          pvVar16 = bottom_blob->data;
          iVar4 = bottom_blob->w;
          pMVar9 = (Mat *)0x0;
          if ((int)uVar26 < 1) {
            pMVar5 = pMVar9;
          }
          pMVar8 = (Mat *)(ulong)uVar10;
          if ((int)uVar10 < 1) {
            pMVar8 = pMVar9;
          }
          sVar2 = bottom_blob->elemsize;
          for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
            pMVar23 = (Mat *)top_blob->data;
            for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
              fVar31 = *(float *)((long)&pMVar23->data + (long)pMVar6 * 4);
              if (fVar1 <= fVar31) {
                fVar1 = fVar31;
              }
              *(float *)((long)&pMVar23->data + (long)pMVar6 * 4) = fVar1;
            }
            pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
          }
        }
      }
      else if (uVar26 == 1) {
        uVar26 = bottom_blob->w;
        pMVar23 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        uVar25 = 0;
        uVar20 = (ulong)uVar26;
        if ((int)uVar26 < 1) {
          uVar20 = uVar25;
        }
        fVar31 = -3.4028235e+38;
        for (; uVar20 != uVar25; uVar25 = uVar25 + 1) {
          fVar1 = *(float *)((long)bottom_blob->data + uVar25 * 4);
          if (fVar31 <= fVar1) {
            fVar31 = fVar1;
          }
        }
        goto LAB_00138ce5;
      }
    }
    else if (uVar26 == 3) {
      uVar26 = bottom_blob->w;
      lVar22 = (long)(int)uVar26;
      uVar10 = bottom_blob->h;
      uVar28 = bottom_blob->c;
      uVar20 = (ulong)uVar28;
      uVar18 = uVar10 * uVar26;
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar57._0_8_ = SUB168(auVar46 ^ auVar35,0) << 0x3f;
      auVar57._8_8_ = SUB168(auVar46 ^ auVar35,8) << 0x3f;
      iVar4 = movmskpd(3,auVar57);
      bVar21 = reduce_c ^ 1;
      if (iVar4 == 0 && bVar21 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        pMVar23 = (Mat *)(ulong)uVar28;
        Mat::Mat(&sums,uVar28,sVar2,opt->workspace_allocator);
        local_88 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          uVar25 = 0;
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          if ((int)uVar28 < 1) {
            uVar20 = 0;
          }
          for (; uVar25 != uVar20; uVar25 = uVar25 + 1) {
            pMVar23 = bottom_blob;
            Mat::channel(&local_80,bottom_blob,(int)uVar25);
            pvVar16 = local_80.data;
            Mat::~Mat(&local_80);
            fVar31 = -3.4028235e+38;
            for (uVar29 = 0; uVar18 != uVar29; uVar29 = uVar29 + 1) {
              fVar1 = *(float *)((long)pvVar16 + uVar29 * 4);
              if (fVar31 <= fVar1) {
                fVar31 = fVar1;
              }
            }
            *(float *)((long)sums.data + uVar25 * 4) = fVar31;
          }
          fVar31 = -3.4028235e+38;
          for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
            fVar1 = *(float *)((long)sums.data + uVar25 * 4);
            if (fVar31 <= fVar1) {
              fVar31 = fVar1;
            }
          }
          *(float *)top_blob->data = fVar31;
          local_88 = 0;
        }
LAB_0013b9da:
        Mat::~Mat(&sums);
LAB_0013b9e7:
        if (local_88 != 0) {
          return -100;
        }
      }
      else if (iVar4 == 0 && reduce_c == false) {
        pMVar23 = (Mat *)0x1;
        Mat::create(top_blob,1,1,uVar28,sVar2,opt->blob_allocator);
        uVar26 = 0;
        if ((int)uVar18 < 1) {
          uVar18 = 0;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        for (; uVar26 != uVar28; uVar26 = uVar26 + 1) {
          Mat::channel(&sums,bottom_blob,uVar26);
          pvVar16 = sums.data;
          Mat::~Mat(&sums);
          pMVar23 = top_blob;
          Mat::channel(&sums,top_blob,uVar26);
          pvVar17 = sums.data;
          Mat::~Mat(&sums);
          fVar31 = -3.4028235e+38;
          for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
            fVar1 = *(float *)((long)pvVar16 + uVar20 * 4);
            if (fVar31 <= fVar1) {
              fVar31 = fVar1;
            }
          }
          *(float *)pvVar17 = fVar31;
        }
      }
      else {
        bVar24 = (byte)iVar4 >> 1 | bVar14;
        if (reduce_c == false && (bVar24 & 1) == 0) {
          pMVar23 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar10,uVar28,sVar2,opt->blob_allocator);
          uVar20 = 0;
          if (0 < (int)uVar26) {
            uVar20 = (ulong)uVar26;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar28; uVar26 = uVar26 + 1) {
            Mat::channel(&sums,bottom_blob,uVar26);
            pvVar16 = sums.data;
            Mat::~Mat(&sums);
            pMVar23 = top_blob;
            Mat::channel(&sums,top_blob,uVar26);
            pvVar17 = sums.data;
            Mat::~Mat(&sums);
            for (uVar25 = 0; uVar25 != uVar10; uVar25 = uVar25 + 1) {
              fVar31 = -3.4028235e+38;
              for (uVar29 = 0; uVar20 != uVar29; uVar29 = uVar29 + 1) {
                fVar1 = *(float *)((long)pvVar16 + uVar29 * 4);
                if (fVar31 <= fVar1) {
                  fVar31 = fVar1;
                }
              }
              *(float *)((long)pvVar17 + uVar25 * 4) = fVar31;
              pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
            }
          }
        }
        else {
          if ((bVar24 & 1) == 0 && bVar21 == 0) {
            Mat::create(top_blob,1,uVar10,1,sVar2,opt->blob_allocator);
            pMVar23 = (Mat *)0x1;
            Mat::Mat(&sums,1,uVar10,uVar28,sVar2,opt->workspace_allocator);
            local_88 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,-3.4028235e+38);
              uVar29 = 0;
              uVar25 = 0;
              if (0 < (int)uVar26) {
                uVar25 = (ulong)uVar26;
              }
              uVar13 = (ulong)uVar10;
              if ((int)uVar10 < 1) {
                uVar13 = uVar29;
              }
              if ((int)uVar28 < 1) {
                uVar20 = uVar29;
              }
              for (; uVar29 != uVar20; uVar29 = uVar29 + 1) {
                Mat::channel(&local_80,bottom_blob,(int)uVar29);
                pvVar16 = local_80.data;
                Mat::~Mat(&local_80);
                pvVar17 = (void *)(sums.cstep * uVar29 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                local_80.data = pvVar17;
                Mat::~Mat(&local_80);
                for (uVar7 = 0; uVar7 != uVar13; uVar7 = uVar7 + 1) {
                  fVar31 = -3.4028235e+38;
                  for (uVar12 = 0; uVar25 != uVar12; uVar12 = uVar12 + 1) {
                    fVar1 = *(float *)((long)pvVar16 + uVar12 * 4);
                    if (fVar31 <= fVar1) {
                      fVar31 = fVar1;
                    }
                  }
                  *(float *)((long)pvVar17 + uVar7 * 4) = fVar31;
                  pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
                }
              }
              Mat::fill(top_blob,-3.4028235e+38);
              local_88 = 0;
              pMVar23 = bottom_blob;
              for (uVar25 = 0; sVar3 = sums.cstep, sVar2 = sums.elemsize, pvVar16 = sums.data,
                  uVar25 != uVar20; uVar25 = uVar25 + 1) {
                local_80.data = (void *)(sums.cstep * uVar25 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                pMVar23 = (Mat *)sums.allocator;
                Mat::~Mat(&local_80);
                pvVar17 = top_blob->data;
                for (uVar29 = 0; uVar13 != uVar29; uVar29 = uVar29 + 1) {
                  fVar31 = *(float *)((long)pvVar16 + uVar29 * 4 + sVar3 * sVar2 * uVar25);
                  fVar1 = *(float *)((long)pvVar17 + uVar29 * 4);
                  if (fVar31 <= fVar1) {
                    fVar31 = fVar1;
                  }
                  *(float *)((long)pvVar17 + uVar29 * 4) = fVar31;
                }
              }
            }
            goto LAB_0013e9a3;
          }
          bVar24 = (byte)iVar4 | bVar15;
          pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar24);
          if ((bVar24 & 1) == 0 && bVar21 == 0) {
            Mat::create(top_blob,uVar26,1,1,sVar2,opt->blob_allocator);
            pMVar23 = (Mat *)(ulong)uVar26;
            Mat::Mat(&sums,uVar26,1,uVar28,sVar2,opt->workspace_allocator);
            local_88 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,-3.4028235e+38);
              uVar29 = 0;
              uVar25 = 0;
              if (0 < (int)uVar26) {
                uVar25 = (ulong)uVar26;
              }
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              if ((int)uVar28 < 1) {
                uVar20 = uVar29;
              }
              for (; uVar29 != uVar20; uVar29 = uVar29 + 1) {
                Mat::channel(&local_80,bottom_blob,(int)uVar29);
                pvVar17 = local_80.data;
                Mat::~Mat(&local_80);
                sVar3 = sums.cstep;
                sVar2 = sums.elemsize;
                pvVar16 = sums.data;
                local_80.data = (void *)(sums.cstep * uVar29 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                pMVar23 = (Mat *)sums.allocator;
                Mat::~Mat(&local_80);
                lVar27 = sVar3 * sVar2 * uVar29;
                for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                  for (uVar13 = 0; uVar25 != uVar13; uVar13 = uVar13 + 1) {
                    fVar1 = *(float *)((long)pvVar17 + uVar13 * 4);
                    fVar31 = *(float *)((long)pvVar16 + uVar13 * 4 + lVar27);
                    if (fVar1 <= fVar31) {
                      fVar1 = fVar31;
                    }
                    *(float *)((long)pvVar16 + uVar13 * 4 + lVar27) = fVar1;
                  }
                  pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
                }
              }
              Mat::fill(top_blob,-3.4028235e+38);
              for (uVar29 = 0; sVar3 = sums.cstep, sVar2 = sums.elemsize, pvVar16 = sums.data,
                  local_88 = 0, uVar29 != uVar20; uVar29 = uVar29 + 1) {
                local_80.data = (void *)(sums.cstep * uVar29 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                pMVar23 = (Mat *)sums.allocator;
                Mat::~Mat(&local_80);
                pvVar17 = top_blob->data;
                for (uVar13 = 0; uVar25 != uVar13; uVar13 = uVar13 + 1) {
                  fVar31 = *(float *)((long)pvVar16 + uVar13 * 4 + sVar3 * sVar2 * uVar29);
                  fVar1 = *(float *)((long)pvVar17 + uVar13 * 4);
                  if (fVar31 <= fVar1) {
                    fVar31 = fVar1;
                  }
                  *(float *)((long)pvVar17 + uVar13 * 4) = fVar31;
                }
              }
            }
            goto LAB_0013b90b;
          }
          if (((bVar14 | bVar15) & 1) == 0 && bVar21 == 0) {
            pMVar23 = (Mat *)(ulong)uVar26;
            Mat::create(top_blob,uVar26,uVar10,1,sVar2,opt->blob_allocator);
            Mat::fill(top_blob,-3.4028235e+38);
            uVar26 = 0;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            for (; uVar26 != uVar28; uVar26 = uVar26 + 1) {
              pMVar23 = bottom_blob;
              Mat::channel(&sums,bottom_blob,uVar26);
              pvVar17 = sums.data;
              Mat::~Mat(&sums);
              pvVar16 = top_blob->data;
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar31 = *(float *)((long)pvVar17 + uVar20 * 4);
                fVar1 = *(float *)((long)pvVar16 + uVar20 * 4);
                if (fVar31 <= fVar1) {
                  fVar31 = fVar1;
                }
                *(float *)((long)pvVar16 + uVar20 * 4) = fVar31;
              }
            }
          }
          else if (reduce_c == false && (bVar24 & 1) == 0) {
            pMVar23 = (Mat *)(ulong)uVar26;
            Mat::create(top_blob,uVar26,1,uVar28,sVar2,opt->blob_allocator);
            Mat::fill(top_blob,-3.4028235e+38);
            uVar18 = 0;
            uVar20 = 0;
            if (0 < (int)uVar26) {
              uVar20 = (ulong)uVar26;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            for (; uVar18 != uVar28; uVar18 = uVar18 + 1) {
              Mat::channel(&sums,bottom_blob,uVar18);
              pvVar16 = sums.data;
              Mat::~Mat(&sums);
              pMVar23 = top_blob;
              Mat::channel(&sums,top_blob,uVar18);
              pvVar17 = sums.data;
              Mat::~Mat(&sums);
              for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                  fVar1 = *(float *)((long)pvVar16 + uVar25 * 4);
                  fVar31 = *(float *)((long)pvVar17 + uVar25 * 4);
                  if (fVar1 <= fVar31) {
                    fVar1 = fVar31;
                  }
                  *(float *)((long)pvVar17 + uVar25 * 4) = fVar1;
                }
                pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
              }
            }
          }
        }
      }
    }
    else if (uVar26 == 2) {
      uVar26 = bottom_blob->w;
      pMVar5 = (Mat *)(ulong)uVar26;
      uVar10 = bottom_blob->h;
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar56._0_8_ = SUB168(auVar46 ^ auVar34,0) << 0x3f;
      auVar56._8_8_ = SUB168(auVar46 ^ auVar34,8) << 0x3f;
      iVar4 = movmskpd(uVar11,auVar56);
      if (iVar4 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        pMVar23 = (Mat *)(ulong)uVar10;
        Mat::Mat(&sums,uVar10,sVar2,opt->workspace_allocator);
        local_88 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          pMVar9 = (Mat *)0x0;
          if ((int)uVar26 < 1) {
            pMVar5 = pMVar9;
          }
          pvVar16 = bottom_blob->data;
          pMVar8 = (Mat *)(ulong)uVar10;
          if ((int)uVar10 < 1) {
            pMVar8 = pMVar9;
          }
          pMVar23 = (Mat *)((long)bottom_blob->w * bottom_blob->elemsize);
          for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
            fVar31 = -3.4028235e+38;
            for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
              if (fVar31 <= fVar1) {
                fVar31 = fVar1;
              }
            }
            *(float *)((long)sums.data + (long)pMVar9 * 4) = fVar31;
            pvVar16 = (void *)((long)&pMVar23->data + (long)pvVar16);
          }
          fVar31 = -3.4028235e+38;
          for (pMVar5 = (Mat *)0x0; pMVar8 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
            fVar1 = *(float *)((long)sums.data + (long)pMVar5 * 4);
            if (fVar31 <= fVar1) {
              fVar31 = fVar1;
            }
          }
          *(float *)top_blob->data = fVar31;
          local_88 = 0;
        }
LAB_0013b90b:
        Mat::~Mat(&sums);
        goto LAB_0013b9e7;
      }
      bVar21 = (byte)iVar4 >> 1;
      pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar21);
      if (((bVar14 | bVar21) & 1) == 0) {
        Mat::create(top_blob,1,uVar10,sVar2,opt->blob_allocator);
        pvVar16 = bottom_blob->data;
        pMVar9 = (Mat *)0x0;
        if ((int)uVar26 < 1) {
          pMVar5 = pMVar9;
        }
        iVar4 = bottom_blob->w;
        pMVar8 = (Mat *)(ulong)uVar10;
        if ((int)uVar10 < 1) {
          pMVar8 = pMVar9;
        }
        pMVar23 = (Mat *)top_blob->data;
        sVar2 = bottom_blob->elemsize;
        for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
          fVar31 = -3.4028235e+38;
          for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
            fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
            if (fVar31 <= fVar1) {
              fVar31 = fVar1;
            }
          }
          *(float *)((long)&pMVar23->data + (long)pMVar9 * 4) = fVar31;
          pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
        }
      }
      else if (((bVar15 | (byte)iVar4) & 1) == 0) {
        pMVar23 = pMVar5;
        Mat::create(top_blob,uVar26,1,sVar2,opt->blob_allocator);
        Mat::fill(top_blob,-3.4028235e+38);
        pvVar16 = bottom_blob->data;
        iVar4 = bottom_blob->w;
        pMVar9 = (Mat *)0x0;
        if ((int)uVar26 < 1) {
          pMVar5 = pMVar9;
        }
        pMVar8 = (Mat *)(ulong)uVar10;
        if ((int)uVar10 < 1) {
          pMVar8 = pMVar9;
        }
        sVar2 = bottom_blob->elemsize;
        for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
          pMVar23 = (Mat *)top_blob->data;
          for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
            fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
            fVar31 = *(float *)((long)&pMVar23->data + (long)pMVar6 * 4);
            if (fVar1 <= fVar31) {
              fVar1 = fVar31;
            }
            *(float *)((long)&pMVar23->data + (long)pMVar6 * 4) = fVar1;
          }
          pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
        }
      }
    }
    else if (uVar26 == 1) {
      uVar26 = bottom_blob->w;
      pMVar23 = (Mat *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      uVar25 = 0;
      uVar20 = (ulong)uVar26;
      if ((int)uVar26 < 1) {
        uVar20 = uVar25;
      }
      fVar31 = -3.4028235e+38;
      for (; uVar20 != uVar25; uVar25 = uVar25 + 1) {
        fVar1 = *(float *)((long)bottom_blob->data + uVar25 * 4);
        if (fVar31 <= fVar1) {
          fVar31 = fVar1;
        }
      }
LAB_00138ce5:
      *(float *)top_blob->data = fVar31;
    }
LAB_0013b9f0:
    if (ABS(fVar30 + -1.0) <= 1.1920929e-07) {
      return 0;
    }
    goto LAB_0013baeb;
  case 5:
    fVar30 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar26 == 3) {
        uVar26 = bottom_blob->w;
        lVar22 = (long)(int)uVar26;
        uVar10 = bottom_blob->h;
        uVar28 = bottom_blob->c;
        pMVar5 = (Mat *)(ulong)uVar28;
        uVar18 = uVar10 * uVar26;
        auVar44._8_4_ = 0xffffffff;
        auVar44._0_8_ = 0xffffffffffffffff;
        auVar44._12_4_ = 0xffffffff;
        auVar70._0_8_ = SUB168(auVar46 ^ auVar44,0) << 0x3f;
        auVar70._8_8_ = SUB168(auVar46 ^ auVar44,8) << 0x3f;
        iVar4 = movmskpd(3,auVar70);
        bVar21 = reduce_c ^ 1;
        if (iVar4 == 0 && bVar21 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pMVar23 = (Mat *)(ulong)uVar28;
          Mat::Mat(&sums,uVar28,sVar2,opt->workspace_allocator);
          local_88 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            pMVar9 = (Mat *)0x0;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar28 < 1) {
              pMVar5 = (Mat *)0x0;
            }
            for (; pMVar9 != pMVar5; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
              pMVar23 = bottom_blob;
              Mat::channel(&local_80,bottom_blob,(int)pMVar9);
              pvVar16 = local_80.data;
              Mat::~Mat(&local_80);
              fVar31 = 3.4028235e+38;
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar1 = *(float *)((long)pvVar16 + uVar20 * 4);
                if (fVar1 <= fVar31) {
                  fVar31 = fVar1;
                }
              }
              *(float *)((long)sums.data + (long)pMVar9 * 4) = fVar31;
            }
            fVar31 = 3.4028235e+38;
            for (pMVar9 = (Mat *)0x0; pMVar5 != pMVar9; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
              fVar1 = *(float *)((long)sums.data + (long)pMVar9 * 4);
              if (fVar1 <= fVar31) {
                fVar31 = fVar1;
              }
            }
            *(float *)top_blob->data = fVar31;
            local_88 = 0;
          }
          goto LAB_0013ba48;
        }
        if (iVar4 == 0 && reduce_c == false) {
          pMVar23 = pMVar5;
          Mat::create(top_blob,uVar28,sVar2,opt->blob_allocator);
          pMVar8 = (Mat *)0x0;
          pMVar9 = (Mat *)(ulong)uVar18;
          if ((int)uVar18 < 1) {
            pMVar9 = pMVar8;
          }
          if ((int)uVar28 < 1) {
            pMVar5 = pMVar8;
          }
          for (; pMVar8 != pMVar5; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            pMVar23 = bottom_blob;
            Mat::channel(&sums,bottom_blob,(int)pMVar8);
            pvVar16 = sums.data;
            Mat::~Mat(&sums);
            fVar31 = 3.4028235e+38;
            for (pMVar6 = (Mat *)0x0; pMVar9 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
              if (fVar1 <= fVar31) {
                fVar31 = fVar1;
              }
            }
            *(float *)((long)top_blob->data + (long)pMVar8 * 4) = fVar31;
          }
        }
        else {
          bVar24 = (byte)iVar4 >> 1 | bVar14;
          if (reduce_c != false || (bVar24 & 1) != 0) {
            if ((bVar24 & 1) == 0 && bVar21 == 0) {
              Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
              pMVar23 = (Mat *)0x1;
              Mat::Mat(&sums,1,uVar10,uVar28,sVar2,opt->workspace_allocator);
              local_88 = -100;
              if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
                Mat::fill(&sums,3.4028235e+38);
                pMVar23 = (Mat *)0x0;
                uVar20 = 0;
                if (0 < (int)uVar26) {
                  uVar20 = (ulong)uVar26;
                }
                pMVar9 = (Mat *)(ulong)uVar10;
                if ((int)uVar10 < 1) {
                  pMVar9 = pMVar23;
                }
                if ((int)uVar28 < 1) {
                  pMVar5 = pMVar23;
                }
                for (; pMVar23 != pMVar5; pMVar23 = (Mat *)((long)&pMVar23->data + 1)) {
                  Mat::channel(&local_80,bottom_blob,(int)pMVar23);
                  pvVar16 = local_80.data;
                  Mat::~Mat(&local_80);
                  pvVar17 = (void *)(sums.cstep * (long)pMVar23 * sums.elemsize + (long)sums.data);
                  local_80.refcount = (int *)0x0;
                  local_80.elemsize = sums.elemsize;
                  local_80.elempack = sums.elempack;
                  local_80.allocator = sums.allocator;
                  local_80.dims = 2;
                  local_80.w = sums.w;
                  local_80.h = sums.h;
                  local_80.c = 1;
                  local_80.cstep = (size_t)(sums.h * sums.w);
                  local_80.data = pvVar17;
                  Mat::~Mat(&local_80);
                  for (pMVar8 = (Mat *)0x0; pMVar8 != pMVar9;
                      pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
                    fVar31 = 3.4028235e+38;
                    for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                      fVar1 = *(float *)((long)pvVar16 + uVar25 * 4);
                      if (fVar1 <= fVar31) {
                        fVar31 = fVar1;
                      }
                    }
                    *(float *)((long)pvVar17 + (long)pMVar8 * 4) = fVar31;
                    pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
                  }
                }
                Mat::fill(top_blob,3.4028235e+38);
                local_88 = 0;
                pMVar23 = bottom_blob;
                for (pMVar8 = (Mat *)0x0; sVar3 = sums.cstep, sVar2 = sums.elemsize,
                    pvVar16 = sums.data, pMVar8 != pMVar5; pMVar8 = (Mat *)((long)&pMVar8->data + 1)
                    ) {
                  local_80.data =
                       (void *)(sums.cstep * (long)pMVar8 * sums.elemsize + (long)sums.data);
                  local_80.refcount = (int *)0x0;
                  local_80.elemsize = sums.elemsize;
                  local_80.elempack = sums.elempack;
                  local_80.allocator = sums.allocator;
                  local_80.dims = 2;
                  local_80.w = sums.w;
                  local_80.h = sums.h;
                  local_80.c = 1;
                  local_80.cstep = (size_t)(sums.h * sums.w);
                  pMVar23 = (Mat *)sums.allocator;
                  Mat::~Mat(&local_80);
                  pvVar17 = top_blob->data;
                  for (pMVar6 = (Mat *)0x0; pMVar9 != pMVar6;
                      pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
                    fVar31 = *(float *)((long)pvVar16 +
                                       (long)pMVar6 * 4 + sVar3 * sVar2 * (long)pMVar8);
                    fVar1 = *(float *)((long)pvVar17 + (long)pMVar6 * 4);
                    if (fVar1 <= fVar31) {
                      fVar31 = fVar1;
                    }
                    *(float *)((long)pvVar17 + (long)pMVar6 * 4) = fVar31;
                  }
                }
              }
            }
            else {
              bVar24 = (byte)iVar4 | bVar15;
              pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar24);
              if ((bVar24 & 1) != 0 || bVar21 != 0) {
                if (((bVar14 | bVar15) & 1) == 0 && bVar21 == 0) {
                  pMVar23 = (Mat *)(ulong)uVar26;
                  Mat::create(top_blob,uVar26,uVar10,sVar2,opt->blob_allocator);
                  Mat::fill(top_blob,3.4028235e+38);
                  uVar26 = 0;
                  if ((int)uVar18 < 1) {
                    uVar18 = 0;
                  }
                  if ((int)uVar28 < 1) {
                    uVar28 = 0;
                  }
                  for (; uVar26 != uVar28; uVar26 = uVar26 + 1) {
                    pMVar23 = bottom_blob;
                    Mat::channel(&sums,bottom_blob,uVar26);
                    pvVar17 = sums.data;
                    Mat::~Mat(&sums);
                    pvVar16 = top_blob->data;
                    for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                      fVar31 = *(float *)((long)pvVar17 + uVar20 * 4);
                      fVar1 = *(float *)((long)pvVar16 + uVar20 * 4);
                      if (fVar1 <= fVar31) {
                        fVar31 = fVar1;
                      }
                      *(float *)((long)pvVar16 + uVar20 * 4) = fVar31;
                    }
                  }
                }
                else if (reduce_c == false && (bVar24 & 1) == 0) {
                  pMVar23 = (Mat *)(ulong)uVar26;
                  Mat::create(top_blob,uVar26,uVar28,sVar2,opt->blob_allocator);
                  Mat::fill(top_blob,3.4028235e+38);
                  uVar18 = 0;
                  uVar20 = 0;
                  if (0 < (int)uVar26) {
                    uVar20 = (ulong)uVar26;
                  }
                  if ((int)uVar10 < 1) {
                    uVar10 = 0;
                  }
                  if ((int)uVar28 < 1) {
                    uVar28 = 0;
                  }
                  for (; uVar18 != uVar28; uVar18 = uVar18 + 1) {
                    pMVar23 = bottom_blob;
                    Mat::channel(&sums,bottom_blob,uVar18);
                    pvVar17 = sums.data;
                    Mat::~Mat(&sums);
                    lVar27 = (long)(int)(top_blob->w * uVar18) * top_blob->elemsize;
                    pvVar16 = top_blob->data;
                    for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                      for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                        fVar1 = *(float *)((long)pvVar17 + uVar25 * 4);
                        fVar31 = *(float *)((long)pvVar16 + uVar25 * 4 + lVar27);
                        if (fVar31 <= fVar1) {
                          fVar1 = fVar31;
                        }
                        *(float *)((long)pvVar16 + uVar25 * 4 + lVar27) = fVar1;
                      }
                      pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
                    }
                  }
                }
                goto joined_r0x0013bae5;
              }
              Mat::create(top_blob,uVar26,sVar2,opt->blob_allocator);
              pMVar23 = (Mat *)(ulong)uVar26;
              Mat::Mat(&sums,uVar26,1,uVar28,sVar2,opt->workspace_allocator);
              local_88 = -100;
              if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
                Mat::fill(&sums,3.4028235e+38);
                pMVar9 = (Mat *)0x0;
                uVar20 = 0;
                if (0 < (int)uVar26) {
                  uVar20 = (ulong)uVar26;
                }
                if ((int)uVar10 < 1) {
                  uVar10 = 0;
                }
                if ((int)uVar28 < 1) {
                  pMVar5 = pMVar9;
                }
                for (; pMVar9 != pMVar5; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
                  Mat::channel(&local_80,bottom_blob,(int)pMVar9);
                  pvVar17 = local_80.data;
                  Mat::~Mat(&local_80);
                  sVar3 = sums.cstep;
                  sVar2 = sums.elemsize;
                  pvVar16 = sums.data;
                  local_80.data =
                       (void *)(sums.cstep * (long)pMVar9 * sums.elemsize + (long)sums.data);
                  local_80.refcount = (int *)0x0;
                  local_80.elemsize = sums.elemsize;
                  local_80.elempack = sums.elempack;
                  local_80.allocator = sums.allocator;
                  local_80.dims = 2;
                  local_80.w = sums.w;
                  local_80.h = sums.h;
                  local_80.c = 1;
                  local_80.cstep = (size_t)(sums.h * sums.w);
                  pMVar23 = (Mat *)sums.allocator;
                  Mat::~Mat(&local_80);
                  lVar27 = sVar3 * sVar2 * (long)pMVar9;
                  for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                    for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                      fVar1 = *(float *)((long)pvVar17 + uVar25 * 4);
                      fVar31 = *(float *)((long)pvVar16 + uVar25 * 4 + lVar27);
                      if (fVar31 <= fVar1) {
                        fVar1 = fVar31;
                      }
                      *(float *)((long)pvVar16 + uVar25 * 4 + lVar27) = fVar1;
                    }
                    pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
                  }
                }
                Mat::fill(top_blob,3.4028235e+38);
                local_88 = 0;
                for (pMVar9 = (Mat *)0x0; sVar3 = sums.cstep, sVar2 = sums.elemsize,
                    pvVar16 = sums.data, pMVar9 != pMVar5; pMVar9 = (Mat *)((long)&pMVar9->data + 1)
                    ) {
                  local_80.data =
                       (void *)(sums.cstep * (long)pMVar9 * sums.elemsize + (long)sums.data);
                  local_80.refcount = (int *)0x0;
                  local_80.elemsize = sums.elemsize;
                  local_80.elempack = sums.elempack;
                  local_80.allocator = sums.allocator;
                  local_80.dims = 2;
                  local_80.w = sums.w;
                  local_80.h = sums.h;
                  local_80.c = 1;
                  local_80.cstep = (size_t)(sums.h * sums.w);
                  pMVar23 = (Mat *)sums.allocator;
                  Mat::~Mat(&local_80);
                  pvVar17 = top_blob->data;
                  for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                    fVar31 = *(float *)((long)pvVar16 + uVar25 * 4 + sVar3 * sVar2 * (long)pMVar9);
                    fVar1 = *(float *)((long)pvVar17 + uVar25 * 4);
                    if (fVar1 <= fVar31) {
                      fVar31 = fVar1;
                    }
                    *(float *)((long)pvVar17 + uVar25 * 4) = fVar31;
                  }
                }
              }
            }
LAB_0013eaa4:
            Mat::~Mat(&sums);
            goto joined_r0x0013bac3;
          }
          pMVar23 = (Mat *)(ulong)uVar10;
          Mat::create(top_blob,uVar10,uVar28,sVar2,opt->blob_allocator);
          uVar18 = 0;
          uVar20 = 0;
          if (0 < (int)uVar26) {
            uVar20 = (ulong)uVar26;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          for (; uVar18 != uVar28; uVar18 = uVar18 + 1) {
            pMVar23 = bottom_blob;
            Mat::channel(&sums,bottom_blob,uVar18);
            pvVar17 = sums.data;
            Mat::~Mat(&sums);
            iVar4 = top_blob->w;
            sVar2 = top_blob->elemsize;
            pvVar16 = top_blob->data;
            for (uVar25 = 0; uVar25 != uVar10; uVar25 = uVar25 + 1) {
              fVar31 = 3.4028235e+38;
              for (uVar29 = 0; uVar20 != uVar29; uVar29 = uVar29 + 1) {
                fVar1 = *(float *)((long)pvVar17 + uVar29 * 4);
                if (fVar1 <= fVar31) {
                  fVar31 = fVar1;
                }
              }
              *(float *)((long)pvVar16 + uVar25 * 4 + (long)(int)uVar18 * (long)iVar4 * sVar2) =
                   fVar31;
              pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
            }
          }
        }
      }
      else if (uVar26 == 2) {
        uVar26 = bottom_blob->w;
        pMVar5 = (Mat *)(ulong)uVar26;
        uVar10 = bottom_blob->h;
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar67._0_8_ = SUB168(auVar46 ^ auVar42,0) << 0x3f;
        auVar67._8_8_ = SUB168(auVar46 ^ auVar42,8) << 0x3f;
        iVar4 = movmskpd(uVar11,auVar67);
        if (iVar4 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pMVar23 = (Mat *)(ulong)uVar10;
          Mat::Mat(&sums,uVar10,sVar2,opt->workspace_allocator);
          local_88 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            pMVar9 = (Mat *)0x0;
            if ((int)uVar26 < 1) {
              pMVar5 = pMVar9;
            }
            pvVar16 = bottom_blob->data;
            pMVar8 = (Mat *)(ulong)uVar10;
            if ((int)uVar10 < 1) {
              pMVar8 = pMVar9;
            }
            pMVar23 = (Mat *)((long)bottom_blob->w * bottom_blob->elemsize);
            for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
              fVar31 = 3.4028235e+38;
              for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1))
              {
                fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
                if (fVar1 <= fVar31) {
                  fVar31 = fVar1;
                }
              }
              *(float *)((long)sums.data + (long)pMVar9 * 4) = fVar31;
              pvVar16 = (void *)((long)&pMVar23->data + (long)pvVar16);
            }
            fVar31 = 3.4028235e+38;
            for (pMVar5 = (Mat *)0x0; pMVar8 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
              fVar1 = *(float *)((long)sums.data + (long)pMVar5 * 4);
              if (fVar1 <= fVar31) {
                fVar31 = fVar1;
              }
            }
            *(float *)top_blob->data = fVar31;
            local_88 = 0;
          }
          goto LAB_0013b942;
        }
        bVar21 = (byte)iVar4 >> 1;
        pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar21);
        if (((bVar14 | bVar21) & 1) == 0) {
          Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
          pvVar16 = bottom_blob->data;
          pMVar9 = (Mat *)0x0;
          if ((int)uVar26 < 1) {
            pMVar5 = pMVar9;
          }
          iVar4 = bottom_blob->w;
          pMVar8 = (Mat *)(ulong)uVar10;
          if ((int)uVar10 < 1) {
            pMVar8 = pMVar9;
          }
          pMVar23 = (Mat *)top_blob->data;
          sVar2 = bottom_blob->elemsize;
          for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
            fVar31 = 3.4028235e+38;
            for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
              if (fVar1 <= fVar31) {
                fVar31 = fVar1;
              }
            }
            *(float *)((long)&pMVar23->data + (long)pMVar9 * 4) = fVar31;
            pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
          }
        }
        else if (((bVar15 | (byte)iVar4) & 1) == 0) {
          pMVar23 = pMVar5;
          Mat::create(top_blob,uVar26,sVar2,opt->blob_allocator);
          Mat::fill(top_blob,3.4028235e+38);
          pvVar16 = bottom_blob->data;
          iVar4 = bottom_blob->w;
          pMVar9 = (Mat *)0x0;
          if ((int)uVar26 < 1) {
            pMVar5 = pMVar9;
          }
          pMVar8 = (Mat *)(ulong)uVar10;
          if ((int)uVar10 < 1) {
            pMVar8 = pMVar9;
          }
          sVar2 = bottom_blob->elemsize;
          for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
            pMVar23 = (Mat *)top_blob->data;
            for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
              fVar31 = *(float *)((long)&pMVar23->data + (long)pMVar6 * 4);
              if (fVar31 <= fVar1) {
                fVar1 = fVar31;
              }
              *(float *)((long)&pMVar23->data + (long)pMVar6 * 4) = fVar1;
            }
            pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
          }
        }
      }
      else if (uVar26 == 1) {
        uVar26 = bottom_blob->w;
        pMVar23 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        uVar25 = 0;
        uVar20 = (ulong)uVar26;
        if ((int)uVar26 < 1) {
          uVar20 = uVar25;
        }
        fVar31 = 3.4028235e+38;
        for (; uVar20 != uVar25; uVar25 = uVar25 + 1) {
          fVar1 = *(float *)((long)bottom_blob->data + uVar25 * 4);
          if (fVar1 <= fVar31) {
            fVar31 = fVar1;
          }
        }
        goto LAB_00138d4f;
      }
    }
    else if (uVar26 == 3) {
      uVar26 = bottom_blob->w;
      lVar22 = (long)(int)uVar26;
      uVar10 = bottom_blob->h;
      uVar28 = bottom_blob->c;
      uVar20 = (ulong)uVar28;
      uVar18 = uVar10 * uVar26;
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar61._0_8_ = SUB168(auVar46 ^ auVar38,0) << 0x3f;
      auVar61._8_8_ = SUB168(auVar46 ^ auVar38,8) << 0x3f;
      iVar4 = movmskpd(3,auVar61);
      bVar21 = reduce_c ^ 1;
      if (iVar4 == 0 && bVar21 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        pMVar23 = (Mat *)(ulong)uVar28;
        Mat::Mat(&sums,uVar28,sVar2,opt->workspace_allocator);
        local_88 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          uVar25 = 0;
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          if ((int)uVar28 < 1) {
            uVar20 = 0;
          }
          for (; uVar25 != uVar20; uVar25 = uVar25 + 1) {
            pMVar23 = bottom_blob;
            Mat::channel(&local_80,bottom_blob,(int)uVar25);
            pvVar16 = local_80.data;
            Mat::~Mat(&local_80);
            fVar31 = 3.4028235e+38;
            for (uVar29 = 0; uVar18 != uVar29; uVar29 = uVar29 + 1) {
              fVar1 = *(float *)((long)pvVar16 + uVar29 * 4);
              if (fVar1 <= fVar31) {
                fVar31 = fVar1;
              }
            }
            *(float *)((long)sums.data + uVar25 * 4) = fVar31;
          }
          fVar31 = 3.4028235e+38;
          for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
            fVar1 = *(float *)((long)sums.data + uVar25 * 4);
            if (fVar1 <= fVar31) {
              fVar31 = fVar1;
            }
          }
          *(float *)top_blob->data = fVar31;
          local_88 = 0;
        }
LAB_0013ba48:
        Mat::~Mat(&sums);
joined_r0x0013bac3:
        if (local_88 != 0) {
          return -100;
        }
      }
      else if (iVar4 == 0 && reduce_c == false) {
        pMVar23 = (Mat *)0x1;
        Mat::create(top_blob,1,1,uVar28,sVar2,opt->blob_allocator);
        uVar26 = 0;
        if ((int)uVar18 < 1) {
          uVar18 = 0;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        for (; uVar26 != uVar28; uVar26 = uVar26 + 1) {
          Mat::channel(&sums,bottom_blob,uVar26);
          pvVar16 = sums.data;
          Mat::~Mat(&sums);
          pMVar23 = top_blob;
          Mat::channel(&sums,top_blob,uVar26);
          pvVar17 = sums.data;
          Mat::~Mat(&sums);
          fVar31 = 3.4028235e+38;
          for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
            fVar1 = *(float *)((long)pvVar16 + uVar20 * 4);
            if (fVar1 <= fVar31) {
              fVar31 = fVar1;
            }
          }
          *(float *)pvVar17 = fVar31;
        }
      }
      else {
        bVar24 = (byte)iVar4 >> 1 | bVar14;
        if (reduce_c == false && (bVar24 & 1) == 0) {
          pMVar23 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar10,uVar28,sVar2,opt->blob_allocator);
          uVar20 = 0;
          if (0 < (int)uVar26) {
            uVar20 = (ulong)uVar26;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar28; uVar26 = uVar26 + 1) {
            Mat::channel(&sums,bottom_blob,uVar26);
            pvVar16 = sums.data;
            Mat::~Mat(&sums);
            pMVar23 = top_blob;
            Mat::channel(&sums,top_blob,uVar26);
            pvVar17 = sums.data;
            Mat::~Mat(&sums);
            for (uVar25 = 0; uVar25 != uVar10; uVar25 = uVar25 + 1) {
              fVar31 = 3.4028235e+38;
              for (uVar29 = 0; uVar20 != uVar29; uVar29 = uVar29 + 1) {
                fVar1 = *(float *)((long)pvVar16 + uVar29 * 4);
                if (fVar1 <= fVar31) {
                  fVar31 = fVar1;
                }
              }
              *(float *)((long)pvVar17 + uVar25 * 4) = fVar31;
              pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
            }
          }
        }
        else {
          if ((bVar24 & 1) == 0 && bVar21 == 0) {
            Mat::create(top_blob,1,uVar10,1,sVar2,opt->blob_allocator);
            pMVar23 = (Mat *)0x1;
            Mat::Mat(&sums,1,uVar10,uVar28,sVar2,opt->workspace_allocator);
            local_88 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,3.4028235e+38);
              uVar29 = 0;
              uVar25 = 0;
              if (0 < (int)uVar26) {
                uVar25 = (ulong)uVar26;
              }
              uVar13 = (ulong)uVar10;
              if ((int)uVar10 < 1) {
                uVar13 = uVar29;
              }
              if ((int)uVar28 < 1) {
                uVar20 = uVar29;
              }
              for (; uVar29 != uVar20; uVar29 = uVar29 + 1) {
                Mat::channel(&local_80,bottom_blob,(int)uVar29);
                pvVar16 = local_80.data;
                Mat::~Mat(&local_80);
                pvVar17 = (void *)(sums.cstep * uVar29 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                local_80.data = pvVar17;
                Mat::~Mat(&local_80);
                for (uVar7 = 0; uVar7 != uVar13; uVar7 = uVar7 + 1) {
                  fVar31 = 3.4028235e+38;
                  for (uVar12 = 0; uVar25 != uVar12; uVar12 = uVar12 + 1) {
                    fVar1 = *(float *)((long)pvVar16 + uVar12 * 4);
                    if (fVar1 <= fVar31) {
                      fVar31 = fVar1;
                    }
                  }
                  *(float *)((long)pvVar17 + uVar7 * 4) = fVar31;
                  pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
                }
              }
              Mat::fill(top_blob,3.4028235e+38);
              local_88 = 0;
              pMVar23 = bottom_blob;
              for (uVar25 = 0; sVar3 = sums.cstep, sVar2 = sums.elemsize, pvVar16 = sums.data,
                  uVar25 != uVar20; uVar25 = uVar25 + 1) {
                local_80.data = (void *)(sums.cstep * uVar25 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                pMVar23 = (Mat *)sums.allocator;
                Mat::~Mat(&local_80);
                pvVar17 = top_blob->data;
                for (uVar29 = 0; uVar13 != uVar29; uVar29 = uVar29 + 1) {
                  fVar31 = *(float *)((long)pvVar16 + uVar29 * 4 + sVar3 * sVar2 * uVar25);
                  fVar1 = *(float *)((long)pvVar17 + uVar29 * 4);
                  if (fVar1 <= fVar31) {
                    fVar31 = fVar1;
                  }
                  *(float *)((long)pvVar17 + uVar29 * 4) = fVar31;
                }
              }
            }
            goto LAB_0013eaa4;
          }
          bVar24 = (byte)iVar4 | bVar15;
          pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar24);
          if ((bVar24 & 1) == 0 && bVar21 == 0) {
            Mat::create(top_blob,uVar26,1,1,sVar2,opt->blob_allocator);
            pMVar23 = (Mat *)(ulong)uVar26;
            Mat::Mat(&sums,uVar26,1,uVar28,sVar2,opt->workspace_allocator);
            local_88 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,3.4028235e+38);
              uVar29 = 0;
              uVar25 = 0;
              if (0 < (int)uVar26) {
                uVar25 = (ulong)uVar26;
              }
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              if ((int)uVar28 < 1) {
                uVar20 = uVar29;
              }
              for (; uVar29 != uVar20; uVar29 = uVar29 + 1) {
                Mat::channel(&local_80,bottom_blob,(int)uVar29);
                pvVar17 = local_80.data;
                Mat::~Mat(&local_80);
                sVar3 = sums.cstep;
                sVar2 = sums.elemsize;
                pvVar16 = sums.data;
                local_80.data = (void *)(sums.cstep * uVar29 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                pMVar23 = (Mat *)sums.allocator;
                Mat::~Mat(&local_80);
                lVar27 = sVar3 * sVar2 * uVar29;
                for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                  for (uVar13 = 0; uVar25 != uVar13; uVar13 = uVar13 + 1) {
                    fVar1 = *(float *)((long)pvVar17 + uVar13 * 4);
                    fVar31 = *(float *)((long)pvVar16 + uVar13 * 4 + lVar27);
                    if (fVar31 <= fVar1) {
                      fVar1 = fVar31;
                    }
                    *(float *)((long)pvVar16 + uVar13 * 4 + lVar27) = fVar1;
                  }
                  pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
                }
              }
              Mat::fill(top_blob,3.4028235e+38);
              for (uVar29 = 0; sVar3 = sums.cstep, sVar2 = sums.elemsize, pvVar16 = sums.data,
                  local_88 = 0, uVar29 != uVar20; uVar29 = uVar29 + 1) {
                local_80.data = (void *)(sums.cstep * uVar29 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                pMVar23 = (Mat *)sums.allocator;
                Mat::~Mat(&local_80);
                pvVar17 = top_blob->data;
                for (uVar13 = 0; uVar25 != uVar13; uVar13 = uVar13 + 1) {
                  fVar31 = *(float *)((long)pvVar16 + uVar13 * 4 + sVar3 * sVar2 * uVar29);
                  fVar1 = *(float *)((long)pvVar17 + uVar13 * 4);
                  if (fVar1 <= fVar31) {
                    fVar31 = fVar1;
                  }
                  *(float *)((long)pvVar17 + uVar13 * 4) = fVar31;
                }
              }
            }
            goto LAB_0013b942;
          }
          if (((bVar14 | bVar15) & 1) == 0 && bVar21 == 0) {
            pMVar23 = (Mat *)(ulong)uVar26;
            Mat::create(top_blob,uVar26,uVar10,1,sVar2,opt->blob_allocator);
            Mat::fill(top_blob,3.4028235e+38);
            uVar26 = 0;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            for (; uVar26 != uVar28; uVar26 = uVar26 + 1) {
              pMVar23 = bottom_blob;
              Mat::channel(&sums,bottom_blob,uVar26);
              pvVar17 = sums.data;
              Mat::~Mat(&sums);
              pvVar16 = top_blob->data;
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar31 = *(float *)((long)pvVar17 + uVar20 * 4);
                fVar1 = *(float *)((long)pvVar16 + uVar20 * 4);
                if (fVar1 <= fVar31) {
                  fVar31 = fVar1;
                }
                *(float *)((long)pvVar16 + uVar20 * 4) = fVar31;
              }
            }
          }
          else if (reduce_c == false && (bVar24 & 1) == 0) {
            pMVar23 = (Mat *)(ulong)uVar26;
            Mat::create(top_blob,uVar26,1,uVar28,sVar2,opt->blob_allocator);
            Mat::fill(top_blob,3.4028235e+38);
            uVar18 = 0;
            uVar20 = 0;
            if (0 < (int)uVar26) {
              uVar20 = (ulong)uVar26;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            for (; uVar18 != uVar28; uVar18 = uVar18 + 1) {
              Mat::channel(&sums,bottom_blob,uVar18);
              pvVar16 = sums.data;
              Mat::~Mat(&sums);
              pMVar23 = top_blob;
              Mat::channel(&sums,top_blob,uVar18);
              pvVar17 = sums.data;
              Mat::~Mat(&sums);
              for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                  fVar1 = *(float *)((long)pvVar16 + uVar25 * 4);
                  fVar31 = *(float *)((long)pvVar17 + uVar25 * 4);
                  if (fVar31 <= fVar1) {
                    fVar1 = fVar31;
                  }
                  *(float *)((long)pvVar17 + uVar25 * 4) = fVar1;
                }
                pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
              }
            }
          }
        }
      }
    }
    else if (uVar26 == 2) {
      uVar26 = bottom_blob->w;
      pMVar5 = (Mat *)(ulong)uVar26;
      uVar10 = bottom_blob->h;
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar58._0_8_ = SUB168(auVar46 ^ auVar36,0) << 0x3f;
      auVar58._8_8_ = SUB168(auVar46 ^ auVar36,8) << 0x3f;
      iVar4 = movmskpd(uVar11,auVar58);
      if (iVar4 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        pMVar23 = (Mat *)(ulong)uVar10;
        Mat::Mat(&sums,uVar10,sVar2,opt->workspace_allocator);
        local_88 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          pMVar9 = (Mat *)0x0;
          if ((int)uVar26 < 1) {
            pMVar5 = pMVar9;
          }
          pvVar16 = bottom_blob->data;
          pMVar8 = (Mat *)(ulong)uVar10;
          if ((int)uVar10 < 1) {
            pMVar8 = pMVar9;
          }
          pMVar23 = (Mat *)((long)bottom_blob->w * bottom_blob->elemsize);
          for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
            fVar31 = 3.4028235e+38;
            for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
              if (fVar1 <= fVar31) {
                fVar31 = fVar1;
              }
            }
            *(float *)((long)sums.data + (long)pMVar9 * 4) = fVar31;
            pvVar16 = (void *)((long)&pMVar23->data + (long)pvVar16);
          }
          fVar31 = 3.4028235e+38;
          for (pMVar5 = (Mat *)0x0; pMVar8 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
            fVar1 = *(float *)((long)sums.data + (long)pMVar5 * 4);
            if (fVar1 <= fVar31) {
              fVar31 = fVar1;
            }
          }
          *(float *)top_blob->data = fVar31;
          local_88 = 0;
        }
LAB_0013b942:
        Mat::~Mat(&sums);
        goto joined_r0x0013bac3;
      }
      bVar21 = (byte)iVar4 >> 1;
      pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar21);
      if (((bVar14 | bVar21) & 1) == 0) {
        Mat::create(top_blob,1,uVar10,sVar2,opt->blob_allocator);
        pvVar16 = bottom_blob->data;
        pMVar9 = (Mat *)0x0;
        if ((int)uVar26 < 1) {
          pMVar5 = pMVar9;
        }
        iVar4 = bottom_blob->w;
        pMVar8 = (Mat *)(ulong)uVar10;
        if ((int)uVar10 < 1) {
          pMVar8 = pMVar9;
        }
        pMVar23 = (Mat *)top_blob->data;
        sVar2 = bottom_blob->elemsize;
        for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
          fVar31 = 3.4028235e+38;
          for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
            fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
            if (fVar1 <= fVar31) {
              fVar31 = fVar1;
            }
          }
          *(float *)((long)&pMVar23->data + (long)pMVar9 * 4) = fVar31;
          pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
        }
      }
      else if (((bVar15 | (byte)iVar4) & 1) == 0) {
        pMVar23 = pMVar5;
        Mat::create(top_blob,uVar26,1,sVar2,opt->blob_allocator);
        Mat::fill(top_blob,3.4028235e+38);
        pvVar16 = bottom_blob->data;
        iVar4 = bottom_blob->w;
        pMVar9 = (Mat *)0x0;
        if ((int)uVar26 < 1) {
          pMVar5 = pMVar9;
        }
        pMVar8 = (Mat *)(ulong)uVar10;
        if ((int)uVar10 < 1) {
          pMVar8 = pMVar9;
        }
        sVar2 = bottom_blob->elemsize;
        for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
          pMVar23 = (Mat *)top_blob->data;
          for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
            fVar1 = *(float *)((long)pvVar16 + (long)pMVar6 * 4);
            fVar31 = *(float *)((long)&pMVar23->data + (long)pMVar6 * 4);
            if (fVar31 <= fVar1) {
              fVar1 = fVar31;
            }
            *(float *)((long)&pMVar23->data + (long)pMVar6 * 4) = fVar1;
          }
          pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
        }
      }
    }
    else if (uVar26 == 1) {
      uVar26 = bottom_blob->w;
      pMVar23 = (Mat *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      uVar25 = 0;
      uVar20 = (ulong)uVar26;
      if ((int)uVar26 < 1) {
        uVar20 = uVar25;
      }
      fVar31 = 3.4028235e+38;
      for (; uVar20 != uVar25; uVar25 = uVar25 + 1) {
        fVar1 = *(float *)((long)bottom_blob->data + uVar25 * 4);
        if (fVar1 <= fVar31) {
          fVar31 = fVar1;
        }
      }
LAB_00138d4f:
      *(float *)top_blob->data = fVar31;
    }
    goto joined_r0x0013bae5;
  case 6:
    fVar30 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar26 == 3) {
        uVar26 = bottom_blob->w;
        lVar22 = (long)(int)uVar26;
        uVar10 = bottom_blob->h;
        uVar28 = bottom_blob->c;
        pMVar5 = (Mat *)(ulong)uVar28;
        uVar18 = uVar10 * uVar26;
        auVar45._8_4_ = 0xffffffff;
        auVar45._0_8_ = 0xffffffffffffffff;
        auVar45._12_4_ = 0xffffffff;
        auVar71._0_8_ = SUB168(auVar46 ^ auVar45,0) << 0x3f;
        auVar71._8_8_ = SUB168(auVar46 ^ auVar45,8) << 0x3f;
        iVar4 = movmskpd(3,auVar71);
        bVar21 = reduce_c ^ 1;
        if (iVar4 == 0 && bVar21 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pMVar23 = (Mat *)(ulong)uVar28;
          Mat::Mat(&sums,uVar28,sVar2,opt->workspace_allocator);
          local_88 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            pMVar9 = (Mat *)0x0;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar28 < 1) {
              pMVar5 = (Mat *)0x0;
            }
            for (; pMVar9 != pMVar5; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
              pMVar23 = bottom_blob;
              Mat::channel(&local_80,bottom_blob,(int)pMVar9);
              pvVar16 = local_80.data;
              Mat::~Mat(&local_80);
              fVar31 = 1.0;
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar31 = fVar31 * *(float *)((long)pvVar16 + uVar20 * 4);
              }
              *(float *)((long)sums.data + (long)pMVar9 * 4) = fVar31;
            }
            fVar31 = 1.0;
            for (pMVar9 = (Mat *)0x0; pMVar5 != pMVar9; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
              fVar31 = fVar31 * *(float *)((long)sums.data + (long)pMVar9 * 4);
            }
            *(float *)top_blob->data = fVar31;
            local_88 = 0;
          }
          goto LAB_0013bab3;
        }
        if (iVar4 == 0 && reduce_c == false) {
          pMVar23 = pMVar5;
          Mat::create(top_blob,uVar28,sVar2,opt->blob_allocator);
          pMVar8 = (Mat *)0x0;
          pMVar9 = (Mat *)(ulong)uVar18;
          if ((int)uVar18 < 1) {
            pMVar9 = pMVar8;
          }
          if ((int)uVar28 < 1) {
            pMVar5 = pMVar8;
          }
          for (; pMVar8 != pMVar5; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            pMVar23 = bottom_blob;
            Mat::channel(&sums,bottom_blob,(int)pMVar8);
            pvVar16 = sums.data;
            Mat::~Mat(&sums);
            fVar31 = 1.0;
            for (pMVar6 = (Mat *)0x0; pMVar9 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar31 = fVar31 * *(float *)((long)pvVar16 + (long)pMVar6 * 4);
            }
            *(float *)((long)top_blob->data + (long)pMVar8 * 4) = fVar31;
          }
        }
        else {
          bVar24 = (byte)iVar4 >> 1 | bVar14;
          if (reduce_c != false || (bVar24 & 1) != 0) {
            if ((bVar24 & 1) == 0 && bVar21 == 0) {
              Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
              pMVar23 = (Mat *)0x1;
              Mat::Mat(&sums,1,uVar10,uVar28,sVar2,opt->workspace_allocator);
              local_88 = -100;
              if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
                Mat::fill(&sums,1.0);
                pMVar23 = (Mat *)0x0;
                uVar20 = 0;
                if (0 < (int)uVar26) {
                  uVar20 = (ulong)uVar26;
                }
                pMVar9 = (Mat *)(ulong)uVar10;
                if ((int)uVar10 < 1) {
                  pMVar9 = pMVar23;
                }
                if ((int)uVar28 < 1) {
                  pMVar5 = pMVar23;
                }
                for (; pMVar23 != pMVar5; pMVar23 = (Mat *)((long)&pMVar23->data + 1)) {
                  Mat::channel(&local_80,bottom_blob,(int)pMVar23);
                  pvVar16 = local_80.data;
                  Mat::~Mat(&local_80);
                  pvVar17 = (void *)(sums.cstep * (long)pMVar23 * sums.elemsize + (long)sums.data);
                  local_80.refcount = (int *)0x0;
                  local_80.elemsize = sums.elemsize;
                  local_80.elempack = sums.elempack;
                  local_80.allocator = sums.allocator;
                  local_80.dims = 2;
                  local_80.w = sums.w;
                  local_80.h = sums.h;
                  local_80.c = 1;
                  local_80.cstep = (size_t)(sums.h * sums.w);
                  local_80.data = pvVar17;
                  Mat::~Mat(&local_80);
                  for (pMVar8 = (Mat *)0x0; pMVar8 != pMVar9;
                      pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
                    fVar31 = 1.0;
                    for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                      fVar31 = fVar31 * *(float *)((long)pvVar16 + uVar25 * 4);
                    }
                    *(float *)((long)pvVar17 + (long)pMVar8 * 4) = fVar31;
                    pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
                  }
                }
                Mat::fill(top_blob,1.0);
                local_88 = 0;
                pMVar23 = bottom_blob;
                for (pMVar8 = (Mat *)0x0; sVar3 = sums.cstep, sVar2 = sums.elemsize,
                    pvVar16 = sums.data, pMVar8 != pMVar5; pMVar8 = (Mat *)((long)&pMVar8->data + 1)
                    ) {
                  local_80.data =
                       (void *)(sums.cstep * (long)pMVar8 * sums.elemsize + (long)sums.data);
                  local_80.refcount = (int *)0x0;
                  local_80.elemsize = sums.elemsize;
                  local_80.elempack = sums.elempack;
                  local_80.allocator = sums.allocator;
                  local_80.dims = 2;
                  local_80.w = sums.w;
                  local_80.h = sums.h;
                  local_80.c = 1;
                  local_80.cstep = (size_t)(sums.h * sums.w);
                  pMVar23 = (Mat *)sums.allocator;
                  Mat::~Mat(&local_80);
                  pvVar17 = top_blob->data;
                  for (pMVar6 = (Mat *)0x0; pMVar9 != pMVar6;
                      pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
                    *(float *)((long)pvVar17 + (long)pMVar6 * 4) =
                         *(float *)((long)pvVar16 + (long)pMVar6 * 4 + sVar3 * sVar2 * (long)pMVar8)
                         * *(float *)((long)pvVar17 + (long)pMVar6 * 4);
                  }
                }
              }
            }
            else {
              bVar24 = (byte)iVar4 | bVar15;
              pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar24);
              if ((bVar24 & 1) != 0 || bVar21 != 0) {
                if (((bVar14 | bVar15) & 1) == 0 && bVar21 == 0) {
                  pMVar23 = (Mat *)(ulong)uVar26;
                  Mat::create(top_blob,uVar26,uVar10,sVar2,opt->blob_allocator);
                  Mat::fill(top_blob,1.0);
                  uVar26 = 0;
                  if ((int)uVar18 < 1) {
                    uVar18 = 0;
                  }
                  if ((int)uVar28 < 1) {
                    uVar28 = 0;
                  }
                  for (; uVar26 != uVar28; uVar26 = uVar26 + 1) {
                    pMVar23 = bottom_blob;
                    Mat::channel(&sums,bottom_blob,uVar26);
                    pvVar17 = sums.data;
                    Mat::~Mat(&sums);
                    pvVar16 = top_blob->data;
                    for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                      *(float *)((long)pvVar16 + uVar20 * 4) =
                           *(float *)((long)pvVar17 + uVar20 * 4) *
                           *(float *)((long)pvVar16 + uVar20 * 4);
                    }
                  }
                }
                else if (reduce_c == false && (bVar24 & 1) == 0) {
                  pMVar23 = (Mat *)(ulong)uVar26;
                  Mat::create(top_blob,uVar26,uVar28,sVar2,opt->blob_allocator);
                  Mat::fill(top_blob,1.0);
                  uVar18 = 0;
                  uVar20 = 0;
                  if (0 < (int)uVar26) {
                    uVar20 = (ulong)uVar26;
                  }
                  if ((int)uVar10 < 1) {
                    uVar10 = 0;
                  }
                  if ((int)uVar28 < 1) {
                    uVar28 = 0;
                  }
                  for (; uVar18 != uVar28; uVar18 = uVar18 + 1) {
                    pMVar23 = bottom_blob;
                    Mat::channel(&sums,bottom_blob,uVar18);
                    pvVar17 = sums.data;
                    Mat::~Mat(&sums);
                    lVar27 = (long)(int)(top_blob->w * uVar18) * top_blob->elemsize;
                    pvVar16 = top_blob->data;
                    for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                      for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                        *(float *)((long)pvVar16 + uVar25 * 4 + lVar27) =
                             *(float *)((long)pvVar17 + uVar25 * 4) *
                             *(float *)((long)pvVar16 + uVar25 * 4 + lVar27);
                      }
                      pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
                    }
                  }
                }
                goto joined_r0x0013bae5;
              }
              Mat::create(top_blob,uVar26,sVar2,opt->blob_allocator);
              pMVar23 = (Mat *)(ulong)uVar26;
              Mat::Mat(&sums,uVar26,1,uVar28,sVar2,opt->workspace_allocator);
              local_88 = -100;
              if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
                Mat::fill(&sums,1.0);
                pMVar9 = (Mat *)0x0;
                uVar20 = 0;
                if (0 < (int)uVar26) {
                  uVar20 = (ulong)uVar26;
                }
                if ((int)uVar10 < 1) {
                  uVar10 = 0;
                }
                if ((int)uVar28 < 1) {
                  pMVar5 = pMVar9;
                }
                for (; pMVar9 != pMVar5; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
                  Mat::channel(&local_80,bottom_blob,(int)pMVar9);
                  pvVar17 = local_80.data;
                  Mat::~Mat(&local_80);
                  sVar3 = sums.cstep;
                  sVar2 = sums.elemsize;
                  pvVar16 = sums.data;
                  local_80.data =
                       (void *)(sums.cstep * (long)pMVar9 * sums.elemsize + (long)sums.data);
                  local_80.refcount = (int *)0x0;
                  local_80.elemsize = sums.elemsize;
                  local_80.elempack = sums.elempack;
                  local_80.allocator = sums.allocator;
                  local_80.dims = 2;
                  local_80.w = sums.w;
                  local_80.h = sums.h;
                  local_80.c = 1;
                  local_80.cstep = (size_t)(sums.h * sums.w);
                  pMVar23 = (Mat *)sums.allocator;
                  Mat::~Mat(&local_80);
                  lVar27 = sVar3 * sVar2 * (long)pMVar9;
                  for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                    for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                      *(float *)((long)pvVar16 + uVar25 * 4 + lVar27) =
                           *(float *)((long)pvVar17 + uVar25 * 4) *
                           *(float *)((long)pvVar16 + uVar25 * 4 + lVar27);
                    }
                    pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
                  }
                }
                Mat::fill(top_blob,1.0);
                local_88 = 0;
                for (pMVar9 = (Mat *)0x0; sVar3 = sums.cstep, sVar2 = sums.elemsize,
                    pvVar16 = sums.data, pMVar9 != pMVar5; pMVar9 = (Mat *)((long)&pMVar9->data + 1)
                    ) {
                  local_80.data =
                       (void *)(sums.cstep * (long)pMVar9 * sums.elemsize + (long)sums.data);
                  local_80.refcount = (int *)0x0;
                  local_80.elemsize = sums.elemsize;
                  local_80.elempack = sums.elempack;
                  local_80.allocator = sums.allocator;
                  local_80.dims = 2;
                  local_80.w = sums.w;
                  local_80.h = sums.h;
                  local_80.c = 1;
                  local_80.cstep = (size_t)(sums.h * sums.w);
                  pMVar23 = (Mat *)sums.allocator;
                  Mat::~Mat(&local_80);
                  pvVar17 = top_blob->data;
                  for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                    *(float *)((long)pvVar17 + uVar25 * 4) =
                         *(float *)((long)pvVar16 + uVar25 * 4 + sVar3 * sVar2 * (long)pMVar9) *
                         *(float *)((long)pvVar17 + uVar25 * 4);
                  }
                }
              }
            }
LAB_0013eba5:
            Mat::~Mat(&sums);
            goto joined_r0x0013bac3;
          }
          pMVar23 = (Mat *)(ulong)uVar10;
          Mat::create(top_blob,uVar10,uVar28,sVar2,opt->blob_allocator);
          uVar18 = 0;
          uVar20 = 0;
          if (0 < (int)uVar26) {
            uVar20 = (ulong)uVar26;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          for (; uVar18 != uVar28; uVar18 = uVar18 + 1) {
            pMVar23 = bottom_blob;
            Mat::channel(&sums,bottom_blob,uVar18);
            pvVar17 = sums.data;
            Mat::~Mat(&sums);
            iVar4 = top_blob->w;
            sVar2 = top_blob->elemsize;
            pvVar16 = top_blob->data;
            for (uVar25 = 0; uVar25 != uVar10; uVar25 = uVar25 + 1) {
              fVar31 = 1.0;
              for (uVar29 = 0; uVar20 != uVar29; uVar29 = uVar29 + 1) {
                fVar31 = fVar31 * *(float *)((long)pvVar17 + uVar29 * 4);
              }
              *(float *)((long)pvVar16 + uVar25 * 4 + (long)(int)uVar18 * (long)iVar4 * sVar2) =
                   fVar31;
              pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
            }
          }
        }
      }
      else if (uVar26 == 2) {
        uVar26 = bottom_blob->w;
        pMVar5 = (Mat *)(ulong)uVar26;
        uVar10 = bottom_blob->h;
        auVar43._8_4_ = 0xffffffff;
        auVar43._0_8_ = 0xffffffffffffffff;
        auVar43._12_4_ = 0xffffffff;
        auVar68._0_8_ = SUB168(auVar46 ^ auVar43,0) << 0x3f;
        auVar68._8_8_ = SUB168(auVar46 ^ auVar43,8) << 0x3f;
        iVar4 = movmskpd(uVar11,auVar68);
        if (iVar4 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pMVar23 = (Mat *)(ulong)uVar10;
          Mat::Mat(&sums,uVar10,sVar2,opt->workspace_allocator);
          local_88 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            pMVar9 = (Mat *)0x0;
            if ((int)uVar26 < 1) {
              pMVar5 = pMVar9;
            }
            pvVar16 = bottom_blob->data;
            pMVar8 = (Mat *)(ulong)uVar10;
            if ((int)uVar10 < 1) {
              pMVar8 = pMVar9;
            }
            pMVar23 = (Mat *)((long)bottom_blob->w * bottom_blob->elemsize);
            for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
              fVar31 = 1.0;
              for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1))
              {
                fVar31 = fVar31 * *(float *)((long)pvVar16 + (long)pMVar6 * 4);
              }
              *(float *)((long)sums.data + (long)pMVar9 * 4) = fVar31;
              pvVar16 = (void *)((long)&pMVar23->data + (long)pvVar16);
            }
            fVar31 = 1.0;
            for (pMVar5 = (Mat *)0x0; pMVar8 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
              fVar31 = fVar31 * *(float *)((long)sums.data + (long)pMVar5 * 4);
            }
            *(float *)top_blob->data = fVar31;
            local_88 = 0;
          }
          goto LAB_0013b979;
        }
        bVar21 = (byte)iVar4 >> 1;
        pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar21);
        if (((bVar14 | bVar21) & 1) == 0) {
          Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
          pvVar16 = bottom_blob->data;
          pMVar9 = (Mat *)0x0;
          if ((int)uVar26 < 1) {
            pMVar5 = pMVar9;
          }
          iVar4 = bottom_blob->w;
          pMVar8 = (Mat *)(ulong)uVar10;
          if ((int)uVar10 < 1) {
            pMVar8 = pMVar9;
          }
          pMVar23 = (Mat *)top_blob->data;
          sVar2 = bottom_blob->elemsize;
          for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
            fVar31 = 1.0;
            for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar31 = fVar31 * *(float *)((long)pvVar16 + (long)pMVar6 * 4);
            }
            *(float *)((long)&pMVar23->data + (long)pMVar9 * 4) = fVar31;
            pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
          }
        }
        else if (((bVar15 | (byte)iVar4) & 1) == 0) {
          pMVar23 = pMVar5;
          Mat::create(top_blob,uVar26,sVar2,opt->blob_allocator);
          Mat::fill(top_blob,1.0);
          pvVar16 = bottom_blob->data;
          iVar4 = bottom_blob->w;
          pMVar9 = (Mat *)0x0;
          if ((int)uVar26 < 1) {
            pMVar5 = pMVar9;
          }
          pMVar8 = (Mat *)(ulong)uVar10;
          if ((int)uVar10 < 1) {
            pMVar8 = pMVar9;
          }
          sVar2 = bottom_blob->elemsize;
          for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
            pMVar23 = (Mat *)top_blob->data;
            for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              *(float *)((long)&pMVar23->data + (long)pMVar6 * 4) =
                   *(float *)((long)pvVar16 + (long)pMVar6 * 4) *
                   *(float *)((long)&pMVar23->data + (long)pMVar6 * 4);
            }
            pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
          }
        }
      }
      else if (uVar26 == 1) {
        uVar26 = bottom_blob->w;
        pMVar23 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        uVar25 = 0;
        uVar20 = (ulong)uVar26;
        if ((int)uVar26 < 1) {
          uVar20 = uVar25;
        }
        fVar31 = 1.0;
        for (; uVar20 != uVar25; uVar25 = uVar25 + 1) {
          fVar31 = fVar31 * *(float *)((long)bottom_blob->data + uVar25 * 4);
        }
        goto LAB_00138d5b;
      }
    }
    else if (uVar26 == 3) {
      uVar26 = bottom_blob->w;
      lVar22 = (long)(int)uVar26;
      uVar10 = bottom_blob->h;
      uVar28 = bottom_blob->c;
      uVar20 = (ulong)uVar28;
      uVar18 = uVar10 * uVar26;
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar62._0_8_ = SUB168(auVar46 ^ auVar39,0) << 0x3f;
      auVar62._8_8_ = SUB168(auVar46 ^ auVar39,8) << 0x3f;
      iVar4 = movmskpd(3,auVar62);
      bVar21 = reduce_c ^ 1;
      if (iVar4 == 0 && bVar21 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        pMVar23 = (Mat *)(ulong)uVar28;
        Mat::Mat(&sums,uVar28,sVar2,opt->workspace_allocator);
        local_88 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          uVar25 = 0;
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          if ((int)uVar28 < 1) {
            uVar20 = 0;
          }
          for (; uVar25 != uVar20; uVar25 = uVar25 + 1) {
            pMVar23 = bottom_blob;
            Mat::channel(&local_80,bottom_blob,(int)uVar25);
            pvVar16 = local_80.data;
            Mat::~Mat(&local_80);
            fVar31 = 1.0;
            for (uVar29 = 0; uVar18 != uVar29; uVar29 = uVar29 + 1) {
              fVar31 = fVar31 * *(float *)((long)pvVar16 + uVar29 * 4);
            }
            *(float *)((long)sums.data + uVar25 * 4) = fVar31;
          }
          fVar31 = 1.0;
          for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
            fVar31 = fVar31 * *(float *)((long)sums.data + uVar25 * 4);
          }
          *(float *)top_blob->data = fVar31;
          local_88 = 0;
        }
LAB_0013bab3:
        Mat::~Mat(&sums);
        goto joined_r0x0013bac3;
      }
      if (iVar4 == 0 && reduce_c == false) {
        pMVar23 = (Mat *)0x1;
        Mat::create(top_blob,1,1,uVar28,sVar2,opt->blob_allocator);
        uVar26 = 0;
        if ((int)uVar18 < 1) {
          uVar18 = 0;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        for (; uVar26 != uVar28; uVar26 = uVar26 + 1) {
          Mat::channel(&sums,bottom_blob,uVar26);
          pvVar16 = sums.data;
          Mat::~Mat(&sums);
          pMVar23 = top_blob;
          Mat::channel(&sums,top_blob,uVar26);
          pvVar17 = sums.data;
          Mat::~Mat(&sums);
          fVar31 = 1.0;
          for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
            fVar31 = fVar31 * *(float *)((long)pvVar16 + uVar20 * 4);
          }
          *(float *)pvVar17 = fVar31;
        }
      }
      else {
        bVar24 = (byte)iVar4 >> 1 | bVar14;
        if (reduce_c == false && (bVar24 & 1) == 0) {
          pMVar23 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar10,uVar28,sVar2,opt->blob_allocator);
          uVar20 = 0;
          if (0 < (int)uVar26) {
            uVar20 = (ulong)uVar26;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar28; uVar26 = uVar26 + 1) {
            Mat::channel(&sums,bottom_blob,uVar26);
            pvVar16 = sums.data;
            Mat::~Mat(&sums);
            pMVar23 = top_blob;
            Mat::channel(&sums,top_blob,uVar26);
            pvVar17 = sums.data;
            Mat::~Mat(&sums);
            for (uVar25 = 0; uVar25 != uVar10; uVar25 = uVar25 + 1) {
              fVar31 = 1.0;
              for (uVar29 = 0; uVar20 != uVar29; uVar29 = uVar29 + 1) {
                fVar31 = fVar31 * *(float *)((long)pvVar16 + uVar29 * 4);
              }
              *(float *)((long)pvVar17 + uVar25 * 4) = fVar31;
              pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
            }
          }
        }
        else {
          if ((bVar24 & 1) == 0 && bVar21 == 0) {
            Mat::create(top_blob,1,uVar10,1,sVar2,opt->blob_allocator);
            pMVar23 = (Mat *)0x1;
            Mat::Mat(&sums,1,uVar10,uVar28,sVar2,opt->workspace_allocator);
            local_88 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,1.0);
              uVar29 = 0;
              uVar25 = 0;
              if (0 < (int)uVar26) {
                uVar25 = (ulong)uVar26;
              }
              uVar13 = (ulong)uVar10;
              if ((int)uVar10 < 1) {
                uVar13 = uVar29;
              }
              if ((int)uVar28 < 1) {
                uVar20 = uVar29;
              }
              for (; uVar29 != uVar20; uVar29 = uVar29 + 1) {
                Mat::channel(&local_80,bottom_blob,(int)uVar29);
                pvVar16 = local_80.data;
                Mat::~Mat(&local_80);
                pvVar17 = (void *)(sums.cstep * uVar29 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                local_80.data = pvVar17;
                Mat::~Mat(&local_80);
                for (uVar7 = 0; uVar7 != uVar13; uVar7 = uVar7 + 1) {
                  fVar31 = 1.0;
                  for (uVar12 = 0; uVar25 != uVar12; uVar12 = uVar12 + 1) {
                    fVar31 = fVar31 * *(float *)((long)pvVar16 + uVar12 * 4);
                  }
                  *(float *)((long)pvVar17 + uVar7 * 4) = fVar31;
                  pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
                }
              }
              Mat::fill(top_blob,1.0);
              local_88 = 0;
              pMVar23 = bottom_blob;
              for (uVar25 = 0; sVar3 = sums.cstep, sVar2 = sums.elemsize, pvVar16 = sums.data,
                  uVar25 != uVar20; uVar25 = uVar25 + 1) {
                local_80.data = (void *)(sums.cstep * uVar25 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                pMVar23 = (Mat *)sums.allocator;
                Mat::~Mat(&local_80);
                pvVar17 = top_blob->data;
                for (uVar29 = 0; uVar13 != uVar29; uVar29 = uVar29 + 1) {
                  *(float *)((long)pvVar17 + uVar29 * 4) =
                       *(float *)((long)pvVar16 + uVar29 * 4 + sVar3 * sVar2 * uVar25) *
                       *(float *)((long)pvVar17 + uVar29 * 4);
                }
              }
            }
            goto LAB_0013eba5;
          }
          bVar24 = (byte)iVar4 | bVar15;
          pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar24);
          if ((bVar24 & 1) == 0 && bVar21 == 0) {
            Mat::create(top_blob,uVar26,1,1,sVar2,opt->blob_allocator);
            pMVar23 = (Mat *)(ulong)uVar26;
            Mat::Mat(&sums,uVar26,1,uVar28,sVar2,opt->workspace_allocator);
            local_88 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,1.0);
              uVar29 = 0;
              uVar25 = 0;
              if (0 < (int)uVar26) {
                uVar25 = (ulong)uVar26;
              }
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              if ((int)uVar28 < 1) {
                uVar20 = uVar29;
              }
              for (; uVar29 != uVar20; uVar29 = uVar29 + 1) {
                Mat::channel(&local_80,bottom_blob,(int)uVar29);
                pvVar17 = local_80.data;
                Mat::~Mat(&local_80);
                sVar3 = sums.cstep;
                sVar2 = sums.elemsize;
                pvVar16 = sums.data;
                local_80.data = (void *)(sums.cstep * uVar29 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                pMVar23 = (Mat *)sums.allocator;
                Mat::~Mat(&local_80);
                lVar27 = sVar3 * sVar2 * uVar29;
                for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                  for (uVar13 = 0; uVar25 != uVar13; uVar13 = uVar13 + 1) {
                    *(float *)((long)pvVar16 + uVar13 * 4 + lVar27) =
                         *(float *)((long)pvVar17 + uVar13 * 4) *
                         *(float *)((long)pvVar16 + uVar13 * 4 + lVar27);
                  }
                  pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
                }
              }
              Mat::fill(top_blob,1.0);
              for (uVar29 = 0; sVar3 = sums.cstep, sVar2 = sums.elemsize, pvVar16 = sums.data,
                  local_88 = 0, uVar29 != uVar20; uVar29 = uVar29 + 1) {
                local_80.data = (void *)(sums.cstep * uVar29 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                pMVar23 = (Mat *)sums.allocator;
                Mat::~Mat(&local_80);
                pvVar17 = top_blob->data;
                for (uVar13 = 0; uVar25 != uVar13; uVar13 = uVar13 + 1) {
                  *(float *)((long)pvVar17 + uVar13 * 4) =
                       *(float *)((long)pvVar16 + uVar13 * 4 + sVar3 * sVar2 * uVar29) *
                       *(float *)((long)pvVar17 + uVar13 * 4);
                }
              }
            }
            goto LAB_0013b979;
          }
          if (((bVar14 | bVar15) & 1) == 0 && bVar21 == 0) {
            pMVar23 = (Mat *)(ulong)uVar26;
            Mat::create(top_blob,uVar26,uVar10,1,sVar2,opt->blob_allocator);
            Mat::fill(top_blob,1.0);
            uVar26 = 0;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            for (; uVar26 != uVar28; uVar26 = uVar26 + 1) {
              pMVar23 = bottom_blob;
              Mat::channel(&sums,bottom_blob,uVar26);
              pvVar17 = sums.data;
              Mat::~Mat(&sums);
              pvVar16 = top_blob->data;
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar16 + uVar20 * 4) =
                     *(float *)((long)pvVar17 + uVar20 * 4) * *(float *)((long)pvVar16 + uVar20 * 4)
                ;
              }
            }
          }
          else if (reduce_c == false && (bVar24 & 1) == 0) {
            pMVar23 = (Mat *)(ulong)uVar26;
            Mat::create(top_blob,uVar26,1,uVar28,sVar2,opt->blob_allocator);
            Mat::fill(top_blob,1.0);
            uVar18 = 0;
            uVar20 = 0;
            if (0 < (int)uVar26) {
              uVar20 = (ulong)uVar26;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            for (; uVar18 != uVar28; uVar18 = uVar18 + 1) {
              Mat::channel(&sums,bottom_blob,uVar18);
              pvVar16 = sums.data;
              Mat::~Mat(&sums);
              pMVar23 = top_blob;
              Mat::channel(&sums,top_blob,uVar18);
              pvVar17 = sums.data;
              Mat::~Mat(&sums);
              for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                  *(float *)((long)pvVar17 + uVar25 * 4) =
                       *(float *)((long)pvVar16 + uVar25 * 4) *
                       *(float *)((long)pvVar17 + uVar25 * 4);
                }
                pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
              }
            }
          }
        }
      }
    }
    else if (uVar26 == 2) {
      uVar26 = bottom_blob->w;
      pMVar5 = (Mat *)(ulong)uVar26;
      uVar10 = bottom_blob->h;
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar59._0_8_ = SUB168(auVar46 ^ auVar37,0) << 0x3f;
      auVar59._8_8_ = SUB168(auVar46 ^ auVar37,8) << 0x3f;
      iVar4 = movmskpd(uVar11,auVar59);
      if (iVar4 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        pMVar23 = (Mat *)(ulong)uVar10;
        Mat::Mat(&sums,uVar10,sVar2,opt->workspace_allocator);
        local_88 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          pMVar9 = (Mat *)0x0;
          if ((int)uVar26 < 1) {
            pMVar5 = pMVar9;
          }
          pvVar16 = bottom_blob->data;
          pMVar8 = (Mat *)(ulong)uVar10;
          if ((int)uVar10 < 1) {
            pMVar8 = pMVar9;
          }
          pMVar23 = (Mat *)((long)bottom_blob->w * bottom_blob->elemsize);
          for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
            fVar31 = 1.0;
            for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar31 = fVar31 * *(float *)((long)pvVar16 + (long)pMVar6 * 4);
            }
            *(float *)((long)sums.data + (long)pMVar9 * 4) = fVar31;
            pvVar16 = (void *)((long)&pMVar23->data + (long)pvVar16);
          }
          fVar31 = 1.0;
          for (pMVar5 = (Mat *)0x0; pMVar8 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
            fVar31 = fVar31 * *(float *)((long)sums.data + (long)pMVar5 * 4);
          }
          *(float *)top_blob->data = fVar31;
          local_88 = 0;
        }
LAB_0013b979:
        Mat::~Mat(&sums);
        goto joined_r0x0013bac3;
      }
      bVar21 = (byte)iVar4 >> 1;
      pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar21);
      if (((bVar14 | bVar21) & 1) == 0) {
        Mat::create(top_blob,1,uVar10,sVar2,opt->blob_allocator);
        pvVar16 = bottom_blob->data;
        pMVar9 = (Mat *)0x0;
        if ((int)uVar26 < 1) {
          pMVar5 = pMVar9;
        }
        iVar4 = bottom_blob->w;
        pMVar8 = (Mat *)(ulong)uVar10;
        if ((int)uVar10 < 1) {
          pMVar8 = pMVar9;
        }
        pMVar23 = (Mat *)top_blob->data;
        sVar2 = bottom_blob->elemsize;
        for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
          fVar31 = 1.0;
          for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
            fVar31 = fVar31 * *(float *)((long)pvVar16 + (long)pMVar6 * 4);
          }
          *(float *)((long)&pMVar23->data + (long)pMVar9 * 4) = fVar31;
          pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
        }
      }
      else if (((bVar15 | (byte)iVar4) & 1) == 0) {
        pMVar23 = pMVar5;
        Mat::create(top_blob,uVar26,1,sVar2,opt->blob_allocator);
        Mat::fill(top_blob,1.0);
        pvVar16 = bottom_blob->data;
        iVar4 = bottom_blob->w;
        pMVar9 = (Mat *)0x0;
        if ((int)uVar26 < 1) {
          pMVar5 = pMVar9;
        }
        pMVar8 = (Mat *)(ulong)uVar10;
        if ((int)uVar10 < 1) {
          pMVar8 = pMVar9;
        }
        sVar2 = bottom_blob->elemsize;
        for (; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
          pMVar23 = (Mat *)top_blob->data;
          for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
            *(float *)((long)&pMVar23->data + (long)pMVar6 * 4) =
                 *(float *)((long)pvVar16 + (long)pMVar6 * 4) *
                 *(float *)((long)&pMVar23->data + (long)pMVar6 * 4);
          }
          pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
        }
      }
    }
    else if (uVar26 == 1) {
      uVar26 = bottom_blob->w;
      pMVar23 = (Mat *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      uVar25 = 0;
      uVar20 = (ulong)uVar26;
      if ((int)uVar26 < 1) {
        uVar20 = uVar25;
      }
      fVar31 = 1.0;
      for (; uVar20 != uVar25; uVar25 = uVar25 + 1) {
        fVar31 = fVar31 * *(float *)((long)bottom_blob->data + uVar25 * 4);
      }
LAB_00138d5b:
      *(float *)top_blob->data = fVar31;
    }
joined_r0x0013bae5:
    if (1.1920929e-07 < ABS(fVar30 + -1.0)) {
LAB_0013baeb:
      reduction_post_process<ncnn::post_process_identity<float>>(top_blob,fVar30,(Option *)pMVar23);
    }
    return 0;
  case 7:
    post_process_00 = (undefined1)this->keepdims;
    auVar50._0_8_ = lVar22 << 0x3f;
    auVar50._8_8_ = lVar27 << 0x3f;
    uVar11 = movmskpd(uVar10,auVar50);
    bVar15 = (byte)uVar11;
    fVar30 = 1.0;
LAB_00138869:
    iVar4 = reduction<ncnn::reduction_op_asum<float>,std::plus<float>,ncnn::post_process_identity<float>>
                      (bottom_blob,top_blob,fVar30,(bool)(bVar15 >> 1),(bool)(bVar15 & 1),reduce_c,
                       (bool)post_process_00,0.0,(int)opt,in_stack_ffffffffffffff00);
    return iVar4;
  case 8:
    if (this->keepdims == 0) {
      auVar55._0_8_ = lVar22 << 0x3f;
      auVar55._8_8_ = lVar27 << 0x3f;
      uVar11 = movmskpd(uVar10,auVar55);
      iVar4 = reduction_op<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                        (bottom_blob,top_blob,fVar30,(bool)((byte)uVar11 >> 1),
                         (bool)((byte)uVar11 & 1),reduce_c,opt);
    }
    else {
      auVar52._0_8_ = lVar22 << 0x3f;
      auVar52._8_8_ = lVar27 << 0x3f;
      uVar11 = movmskpd(uVar10,auVar52);
      iVar4 = reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                        (bottom_blob,top_blob,fVar30,(bool)((byte)uVar11 >> 1),
                         (bool)((byte)uVar11 & 1),reduce_c,opt);
    }
    if (iVar4 == 0) {
      iVar4 = top_blob->dims;
      if (iVar4 == 3) {
        iVar4 = top_blob->c;
        uVar26 = top_blob->h * top_blob->w;
        if (iVar4 != 1) {
          uVar20 = (ulong)uVar26;
          if ((int)uVar26 < 1) {
            uVar20 = 0;
          }
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          for (iVar19 = 0; iVar19 != iVar4; iVar19 = iVar19 + 1) {
            Mat::channel(&sums,top_blob,iVar19);
            pvVar16 = sums.data;
            Mat::~Mat(&sums);
            for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
              *(float *)((long)pvVar16 + uVar25 * 4) = SQRT(*(float *)((long)pvVar16 + uVar25 * 4));
            }
          }
          return 0;
        }
        pvVar16 = top_blob->data;
        uVar20 = (ulong)uVar26;
        if ((int)uVar26 < 1) {
          uVar20 = 0;
        }
        for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
          *(float *)((long)pvVar16 + uVar25 * 4) = SQRT(*(float *)((long)pvVar16 + uVar25 * 4));
        }
        return 0;
      }
      if (iVar4 == 2) {
        uVar26 = top_blob->h * top_blob->w;
        pvVar16 = top_blob->data;
        uVar20 = (ulong)uVar26;
        if ((int)uVar26 < 1) {
          uVar20 = 0;
        }
        for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
          *(float *)((long)pvVar16 + uVar25 * 4) = SQRT(*(float *)((long)pvVar16 + uVar25 * 4));
        }
        return 0;
      }
      if (iVar4 == 1) {
        pvVar16 = top_blob->data;
        uVar20 = (ulong)(uint)top_blob->w;
        if (top_blob->w < 1) {
          uVar20 = 0;
        }
        for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
          *(float *)((long)pvVar16 + uVar25 * 4) = SQRT(*(float *)((long)pvVar16 + uVar25 * 4));
        }
        return 0;
      }
      return 0;
    }
    break;
  case 9:
    pMVar23 = top_blob;
    if (this->keepdims == 0) {
      auVar53._0_8_ = lVar22 << 0x3f;
      auVar53._8_8_ = lVar27 << 0x3f;
      uVar11 = movmskpd(uVar10,auVar53);
      iVar4 = reduction_op<std::plus<float>,std::plus<float>>
                        (bottom_blob,top_blob,fVar30,(bool)((byte)uVar11 >> 1),
                         (bool)((byte)uVar11 & 1),reduce_c,opt);
      fVar30 = extraout_XMM0_Da_00;
    }
    else {
      auVar48._0_8_ = lVar22 << 0x3f;
      auVar48._8_8_ = lVar27 << 0x3f;
      uVar11 = movmskpd(uVar10,auVar48);
      iVar4 = reduction_op_keepdims<std::plus<float>,std::plus<float>>
                        (bottom_blob,top_blob,fVar30,(bool)((byte)uVar11 >> 1),
                         (bool)((byte)uVar11 & 1),reduce_c,opt);
      fVar30 = extraout_XMM0_Da;
    }
    if (iVar4 == 0) {
      reduction_post_process<ncnn::post_process_log<float>>(top_blob,fVar30,(Option *)pMVar23);
      return 0;
    }
    break;
  case 10:
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar26 == 3) {
        uVar26 = bottom_blob->w;
        lVar22 = (long)(int)uVar26;
        uVar10 = bottom_blob->h;
        pMVar5 = (Mat *)(ulong)uVar10;
        uVar28 = bottom_blob->c;
        pMVar9 = (Mat *)(ulong)uVar28;
        uVar18 = uVar10 * uVar26;
        in_XMM0._8_4_ = 0xffffffff;
        in_XMM0._0_8_ = 0xffffffffffffffff;
        in_XMM0._12_4_ = 0xffffffff;
        auVar72._0_8_ = SUB168(auVar46 ^ in_XMM0,0) << 0x3f;
        auVar72._8_8_ = SUB168(auVar46 ^ in_XMM0,8) << 0x3f;
        iVar4 = movmskpd(uVar26,auVar72);
        bVar21 = reduce_c ^ 1;
        pMVar23 = pMVar9;
        if (iVar4 != 0 || bVar21 != 0) {
          if (iVar4 == 0 && reduce_c == false) {
            Mat::create(top_blob,uVar28,sVar2,opt->blob_allocator);
            pMVar8 = (Mat *)0x0;
            pMVar5 = (Mat *)(ulong)uVar18;
            if ((int)uVar18 < 1) {
              pMVar5 = pMVar8;
            }
            in_XMM0 = extraout_XMM0_08;
            if ((int)uVar28 < 1) {
              pMVar9 = pMVar8;
            }
            for (; pMVar8 != pMVar9; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
              pMVar23 = bottom_blob;
              Mat::channel(&sums,bottom_blob,(int)pMVar8);
              pvVar16 = sums.data;
              Mat::~Mat(&sums);
              in_XMM0 = (undefined1  [16])0x0;
              for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1))
              {
                fVar30 = expf(*(float *)((long)pvVar16 + (long)pMVar6 * 4));
                in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar30));
              }
              *(float *)((long)top_blob->data + (long)pMVar8 * 4) = in_XMM0._0_4_;
            }
            goto LAB_0013e894;
          }
          bVar24 = (byte)iVar4 >> 1 | bVar14;
          if (reduce_c == false && (bVar24 & 1) == 0) {
            pMVar23 = pMVar5;
            Mat::create(top_blob,uVar10,uVar28,sVar2,opt->blob_allocator);
            pMVar8 = (Mat *)0x0;
            uVar20 = 0;
            if (0 < (int)uVar26) {
              uVar20 = (ulong)uVar26;
            }
            if ((int)uVar10 < 1) {
              pMVar5 = pMVar8;
            }
            if ((int)uVar28 < 1) {
              pMVar9 = pMVar8;
            }
            in_XMM0 = extraout_XMM0_12;
            while( true ) {
              local_88 = (int)pMVar9;
              iVar4 = (int)pMVar8;
              if (iVar4 == local_88) break;
              pMVar23 = bottom_blob;
              Mat::channel(&sums,bottom_blob,iVar4);
              pvVar17 = sums.data;
              Mat::~Mat(&sums);
              iVar19 = top_blob->w;
              sVar2 = top_blob->elemsize;
              pvVar16 = top_blob->data;
              in_XMM0 = extraout_XMM0_13;
              for (pMVar8 = (Mat *)0x0; pMVar8 != pMVar5; pMVar8 = (Mat *)((long)&pMVar8->data + 1))
              {
                in_XMM0 = (undefined1  [16])0x0;
                for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                  fVar30 = expf(*(float *)((long)pvVar17 + uVar25 * 4));
                  in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar30));
                }
                *(float *)((long)pvVar16 + (long)pMVar8 * 4 + (long)iVar4 * (long)iVar19 * sVar2) =
                     in_XMM0._0_4_;
                pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
              }
              pMVar8 = (Mat *)(ulong)(iVar4 + 1);
            }
            goto LAB_0013e894;
          }
          if ((bVar24 & 1) == 0 && bVar21 == 0) {
            Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
            pMVar23 = (Mat *)0x1;
            Mat::Mat(&sums,1,uVar10,uVar28,sVar2,opt->workspace_allocator);
            local_e0 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,0.0);
              pMVar23 = (Mat *)0x0;
              uVar20 = 0;
              if (0 < (int)uVar26) {
                uVar20 = (ulong)uVar26;
              }
              if ((int)uVar10 < 1) {
                pMVar5 = pMVar23;
              }
              if ((int)uVar28 < 1) {
                pMVar9 = pMVar23;
              }
              for (; pMVar23 != pMVar9; pMVar23 = (Mat *)((long)&pMVar23->data + 1)) {
                Mat::channel(&local_80,bottom_blob,(int)pMVar23);
                pvVar16 = local_80.data;
                Mat::~Mat(&local_80);
                pvVar17 = (void *)(sums.cstep * (long)pMVar23 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                local_80.data = pvVar17;
                Mat::~Mat(&local_80);
                for (pMVar8 = (Mat *)0x0; pMVar8 != pMVar5;
                    pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
                  fVar30 = 0.0;
                  for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                    fVar31 = expf(*(float *)((long)pvVar16 + uVar25 * 4));
                    fVar30 = fVar30 + fVar31;
                  }
                  *(float *)((long)pvVar17 + (long)pMVar8 * 4) = fVar30;
                  pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
                }
              }
              Mat::fill(top_blob,0.0);
              local_e0 = 0;
              pMVar23 = bottom_blob;
              for (pMVar8 = (Mat *)0x0; sVar3 = sums.cstep, sVar2 = sums.elemsize,
                  pvVar16 = sums.data, pMVar8 != pMVar9; pMVar8 = (Mat *)((long)&pMVar8->data + 1))
              {
                local_80.data =
                     (void *)(sums.cstep * (long)pMVar8 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                pMVar23 = (Mat *)sums.allocator;
                Mat::~Mat(&local_80);
                pvVar17 = top_blob->data;
                for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6;
                    pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
                  *(float *)((long)pvVar17 + (long)pMVar6 * 4) =
                       *(float *)((long)pvVar16 + (long)pMVar6 * 4 + sVar3 * sVar2 * (long)pMVar8) +
                       *(float *)((long)pvVar17 + (long)pMVar6 * 4);
                }
              }
            }
          }
          else {
            bVar24 = (byte)iVar4 | bVar15;
            pMVar23 = (Mat *)CONCAT71((int7)(CONCAT44((int)uVar26 >> 0x1f,iVar4) >> 8),bVar24);
            if ((bVar24 & 1) != 0 || bVar21 != 0) {
              if (((bVar14 | bVar15) & 1) == 0 && bVar21 == 0) {
                pMVar23 = (Mat *)(ulong)uVar26;
                Mat::create(top_blob,uVar26,uVar10,sVar2,opt->blob_allocator);
                Mat::fill(top_blob,0.0);
                if ((int)uVar18 < 1) {
                  uVar18 = 0;
                }
                in_XMM0 = extraout_XMM0_16;
                iVar4 = 0;
                if ((int)uVar28 < 1) {
                  pMVar9 = (Mat *)0x0;
                  iVar4 = 0;
                }
                for (; iVar4 != (int)pMVar9; iVar4 = iVar4 + 1) {
                  pMVar23 = bottom_blob;
                  Mat::channel(&sums,bottom_blob,iVar4);
                  pvVar17 = sums.data;
                  Mat::~Mat(&sums);
                  pvVar16 = top_blob->data;
                  in_XMM0 = extraout_XMM0_17;
                  for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                    fVar30 = expf(*(float *)((long)pvVar17 + uVar20 * 4));
                    in_XMM0._0_4_ = fVar30 + *(float *)((long)pvVar16 + uVar20 * 4);
                    in_XMM0._4_12_ = extraout_var_04;
                    *(float *)((long)pvVar16 + uVar20 * 4) = in_XMM0._0_4_;
                  }
                }
              }
              else if (reduce_c == false && (bVar24 & 1) == 0) {
                pMVar23 = (Mat *)(ulong)uVar26;
                Mat::create(top_blob,uVar26,uVar28,sVar2,opt->blob_allocator);
                Mat::fill(top_blob,0.0);
                uVar18 = 0;
                uVar20 = 0;
                if (0 < (int)uVar26) {
                  uVar20 = (ulong)uVar26;
                }
                if ((int)uVar10 < 1) {
                  uVar10 = 0;
                }
                if ((int)uVar28 < 1) {
                  uVar28 = 0;
                }
                in_XMM0 = extraout_XMM0_03;
                for (; uVar18 != uVar28; uVar18 = uVar18 + 1) {
                  pMVar23 = bottom_blob;
                  Mat::channel(&sums,bottom_blob,uVar18);
                  pvVar17 = sums.data;
                  Mat::~Mat(&sums);
                  lVar27 = (long)(int)(top_blob->w * uVar18) * top_blob->elemsize;
                  pvVar16 = top_blob->data;
                  in_XMM0 = extraout_XMM0_04;
                  for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                    for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                      fVar30 = expf(*(float *)((long)pvVar17 + uVar25 * 4));
                      in_XMM0._0_4_ = fVar30 + *(float *)((long)pvVar16 + uVar25 * 4 + lVar27);
                      in_XMM0._4_12_ = extraout_var_02;
                      *(float *)((long)pvVar16 + uVar25 * 4 + lVar27) = in_XMM0._0_4_;
                    }
                    pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
                  }
                }
              }
              goto LAB_0013e894;
            }
            Mat::create(top_blob,uVar26,sVar2,opt->blob_allocator);
            pMVar23 = (Mat *)(ulong)uVar26;
            Mat::Mat(&sums,uVar26,1,uVar28,sVar2,opt->workspace_allocator);
            local_e0 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,0.0);
              pMVar5 = (Mat *)0x0;
              uVar20 = 0;
              if (0 < (int)uVar26) {
                uVar20 = (ulong)uVar26;
              }
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              if ((int)uVar28 < 1) {
                pMVar9 = pMVar5;
              }
              for (; pMVar5 != pMVar9; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
                Mat::channel(&local_80,bottom_blob,(int)pMVar5);
                pvVar17 = local_80.data;
                Mat::~Mat(&local_80);
                sVar3 = sums.cstep;
                sVar2 = sums.elemsize;
                pvVar16 = sums.data;
                local_80.data =
                     (void *)(sums.cstep * (long)pMVar5 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                pMVar23 = (Mat *)sums.allocator;
                Mat::~Mat(&local_80);
                lVar27 = sVar3 * sVar2 * (long)pMVar5;
                for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                  for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                    fVar30 = expf(*(float *)((long)pvVar17 + uVar25 * 4));
                    *(float *)((long)pvVar16 + uVar25 * 4 + lVar27) =
                         fVar30 + *(float *)((long)pvVar16 + uVar25 * 4 + lVar27);
                  }
                  pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
                }
              }
              Mat::fill(top_blob,0.0);
              local_e0 = 0;
              for (pMVar5 = (Mat *)0x0; sVar3 = sums.cstep, sVar2 = sums.elemsize,
                  pvVar16 = sums.data, pMVar5 != pMVar9; pMVar5 = (Mat *)((long)&pMVar5->data + 1))
              {
                local_80.data =
                     (void *)(sums.cstep * (long)pMVar5 * sums.elemsize + (long)sums.data);
                local_80.refcount = (int *)0x0;
                local_80.elemsize = sums.elemsize;
                local_80.elempack = sums.elempack;
                local_80.allocator = sums.allocator;
                local_80.dims = 2;
                local_80.w = sums.w;
                local_80.h = sums.h;
                local_80.c = 1;
                local_80.cstep = (size_t)(sums.h * sums.w);
                pMVar23 = (Mat *)sums.allocator;
                Mat::~Mat(&local_80);
                pvVar17 = top_blob->data;
                for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                  *(float *)((long)pvVar17 + uVar25 * 4) =
                       *(float *)((long)pvVar16 + uVar25 * 4 + sVar3 * sVar2 * (long)pMVar5) +
                       *(float *)((long)pvVar17 + uVar25 * 4);
                }
              }
            }
          }
          goto LAB_0013eca7;
        }
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        Mat::Mat(&sums,uVar28,sVar2,opt->workspace_allocator);
        local_e0 = -100;
        if (sums.data == (void *)0x0) goto LAB_0013ab47;
        if ((long)sums.c * sums.cstep != 0) {
          pMVar8 = (Mat *)0x0;
          pMVar5 = (Mat *)(ulong)uVar18;
          if ((int)uVar18 < 1) {
            pMVar5 = pMVar8;
          }
          if ((int)uVar28 < 1) {
            pMVar9 = pMVar8;
          }
          for (; pMVar8 != pMVar9; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            pMVar23 = bottom_blob;
            Mat::channel(&local_80,bottom_blob,(int)pMVar8);
            pvVar16 = local_80.data;
            Mat::~Mat(&local_80);
            fVar30 = 0.0;
            for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar31 = expf(*(float *)((long)pvVar16 + (long)pMVar6 * 4));
              fVar30 = fVar30 + fVar31;
            }
            *(float *)((long)sums.data + (long)pMVar8 * 4) = fVar30;
          }
          fVar30 = 0.0;
          for (pMVar5 = (Mat *)0x0; pMVar9 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
            fVar30 = fVar30 + *(float *)((long)sums.data + (long)pMVar5 * 4);
          }
          *(float *)top_blob->data = fVar30;
          local_e0 = 0;
        }
      }
      else {
        if (uVar26 != 2) {
          if (uVar26 != 1) goto LAB_0013e894;
          uVar26 = bottom_blob->w;
          pMVar23 = (Mat *)0x1;
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pvVar16 = bottom_blob->data;
          uVar25 = 0;
          uVar20 = (ulong)uVar26;
          if ((int)uVar26 < 1) {
            uVar20 = uVar25;
          }
          in_XMM0 = (undefined1  [16])0x0;
          for (; uVar20 != uVar25; uVar25 = uVar25 + 1) {
            fVar30 = expf(*(float *)((long)pvVar16 + uVar25 * 4));
            in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar30));
          }
          goto LAB_00138d67;
        }
        uVar26 = bottom_blob->w;
        pMVar5 = (Mat *)(ulong)uVar26;
        uVar10 = bottom_blob->h;
        pMVar9 = (Mat *)(ulong)uVar10;
        in_XMM0._8_4_ = 0xffffffff;
        in_XMM0._0_8_ = 0xffffffffffffffff;
        in_XMM0._12_4_ = 0xffffffff;
        auVar69._0_8_ = SUB168(auVar46 ^ in_XMM0,0) << 0x3f;
        auVar69._8_8_ = SUB168(auVar46 ^ in_XMM0,8) << 0x3f;
        iVar4 = movmskpd(uVar11,auVar69);
        if (iVar4 != 0) {
          bVar21 = (byte)iVar4 >> 1;
          pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar21);
          if (((bVar14 | bVar21) & 1) == 0) {
            Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
            pvVar16 = bottom_blob->data;
            iVar4 = bottom_blob->w;
            pvVar17 = top_blob->data;
            pMVar8 = (Mat *)0x0;
            if ((int)uVar26 < 1) {
              pMVar5 = pMVar8;
            }
            pMVar6 = (Mat *)(ulong)uVar10;
            if ((int)uVar10 < 1) {
              pMVar6 = pMVar8;
            }
            sVar2 = bottom_blob->elemsize;
            pMVar23 = pMVar9;
            in_XMM0 = extraout_XMM0_07;
            for (; pMVar8 != pMVar6; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
              in_XMM0 = ZEXT816(0);
              for (pMVar9 = (Mat *)0x0; pMVar5 != pMVar9; pMVar9 = (Mat *)((long)&pMVar9->data + 1))
              {
                fVar30 = expf(*(float *)((long)pvVar16 + (long)pMVar9 * 4));
                in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar30));
              }
              *(float *)((long)pvVar17 + (long)pMVar8 * 4) = in_XMM0._0_4_;
              pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
            }
          }
          else if (((bVar15 | (byte)iVar4) & 1) == 0) {
            pMVar23 = pMVar5;
            Mat::create(top_blob,uVar26,sVar2,opt->blob_allocator);
            Mat::fill(top_blob,0.0);
            pvVar16 = bottom_blob->data;
            iVar4 = bottom_blob->w;
            pMVar8 = (Mat *)0x0;
            if ((int)uVar26 < 1) {
              pMVar5 = pMVar8;
            }
            if ((int)uVar10 < 1) {
              pMVar9 = pMVar8;
            }
            sVar2 = bottom_blob->elemsize;
            in_XMM0 = extraout_XMM0_02;
            for (; pMVar8 != pMVar9; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
              pvVar17 = top_blob->data;
              for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1))
              {
                fVar30 = expf(*(float *)((long)pvVar16 + (long)pMVar6 * 4));
                in_XMM0._0_4_ = fVar30 + *(float *)((long)pvVar17 + (long)pMVar6 * 4);
                in_XMM0._4_12_ = extraout_var_01;
                *(float *)((long)pvVar17 + (long)pMVar6 * 4) = in_XMM0._0_4_;
              }
              pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
            }
          }
          goto LAB_0013e894;
        }
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        pMVar23 = pMVar9;
        Mat::Mat(&sums,uVar10,sVar2,opt->workspace_allocator);
        local_e0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          pvVar16 = bottom_blob->data;
          iVar4 = bottom_blob->w;
          pMVar8 = (Mat *)0x0;
          if ((int)uVar26 < 1) {
            pMVar5 = pMVar8;
          }
          if ((int)uVar10 < 1) {
            pMVar9 = pMVar8;
          }
          sVar2 = bottom_blob->elemsize;
          for (; fVar30 = 0.0, pMVar8 != pMVar9; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar31 = expf(*(float *)((long)pvVar16 + (long)pMVar6 * 4));
              fVar30 = fVar30 + fVar31;
            }
            *(float *)((long)sums.data + (long)pMVar8 * 4) = fVar30;
            pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
          }
          for (pMVar5 = (Mat *)0x0; pMVar9 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
            fVar30 = fVar30 + *(float *)((long)sums.data + (long)pMVar5 * 4);
          }
          *(float *)top_blob->data = fVar30;
          local_e0 = 0;
        }
      }
LAB_0013bb23:
      Mat::~Mat(&sums);
      in_XMM0 = extraout_XMM0_11;
    }
    else {
      if (uVar26 != 3) {
        if (uVar26 != 2) {
          if (uVar26 != 1) goto LAB_0013e894;
          uVar26 = bottom_blob->w;
          pMVar23 = (Mat *)0x1;
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pvVar16 = bottom_blob->data;
          uVar25 = 0;
          uVar20 = (ulong)uVar26;
          if ((int)uVar26 < 1) {
            uVar20 = uVar25;
          }
          in_XMM0 = (undefined1  [16])0x0;
          for (; uVar20 != uVar25; uVar25 = uVar25 + 1) {
            fVar30 = expf(*(float *)((long)pvVar16 + uVar25 * 4));
            in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar30));
          }
LAB_00138d67:
          *(int *)top_blob->data = in_XMM0._0_4_;
          goto LAB_0013e894;
        }
        uVar26 = bottom_blob->w;
        pMVar5 = (Mat *)(ulong)uVar26;
        uVar10 = bottom_blob->h;
        pMVar9 = (Mat *)(ulong)uVar10;
        in_XMM0._8_4_ = 0xffffffff;
        in_XMM0._0_8_ = 0xffffffffffffffff;
        in_XMM0._12_4_ = 0xffffffff;
        auVar60._0_8_ = SUB168(auVar46 ^ in_XMM0,0) << 0x3f;
        auVar60._8_8_ = SUB168(auVar46 ^ in_XMM0,8) << 0x3f;
        iVar4 = movmskpd(uVar11,auVar60);
        if (iVar4 != 0) {
          bVar21 = (byte)iVar4 >> 1;
          pMVar23 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar21);
          if (((bVar14 | bVar21) & 1) == 0) {
            pMVar23 = (Mat *)0x1;
            Mat::create(top_blob,1,uVar10,sVar2,opt->blob_allocator);
            pvVar16 = bottom_blob->data;
            iVar4 = bottom_blob->w;
            pvVar17 = top_blob->data;
            pMVar8 = (Mat *)0x0;
            if ((int)uVar26 < 1) {
              pMVar5 = pMVar8;
            }
            if ((int)uVar10 < 1) {
              pMVar9 = pMVar8;
            }
            sVar2 = bottom_blob->elemsize;
            in_XMM0 = extraout_XMM0_05;
            for (; pMVar8 != pMVar9; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
              in_XMM0 = ZEXT816(0);
              for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1))
              {
                fVar30 = expf(*(float *)((long)pvVar16 + (long)pMVar6 * 4));
                in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar30));
              }
              *(float *)((long)pvVar17 + (long)pMVar8 * 4) = in_XMM0._0_4_;
              pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
            }
          }
          else if (((bVar15 | (byte)iVar4) & 1) == 0) {
            pMVar23 = pMVar5;
            Mat::create(top_blob,uVar26,1,sVar2,opt->blob_allocator);
            Mat::fill(top_blob,0.0);
            pvVar16 = bottom_blob->data;
            iVar4 = bottom_blob->w;
            pMVar8 = (Mat *)0x0;
            if ((int)uVar26 < 1) {
              pMVar5 = pMVar8;
            }
            if ((int)uVar10 < 1) {
              pMVar9 = pMVar8;
            }
            sVar2 = bottom_blob->elemsize;
            in_XMM0 = extraout_XMM0;
            for (; pMVar8 != pMVar9; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
              pvVar17 = top_blob->data;
              for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1))
              {
                fVar30 = expf(*(float *)((long)pvVar16 + (long)pMVar6 * 4));
                in_XMM0._0_4_ = fVar30 + *(float *)((long)pvVar17 + (long)pMVar6 * 4);
                in_XMM0._4_12_ = extraout_var;
                *(float *)((long)pvVar17 + (long)pMVar6 * 4) = in_XMM0._0_4_;
              }
              pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
            }
          }
          goto LAB_0013e894;
        }
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        pMVar23 = pMVar9;
        Mat::Mat(&sums,uVar10,sVar2,opt->workspace_allocator);
        if (sums.data == (void *)0x0) {
          local_e0 = -100;
        }
        else {
          local_e0 = -100;
          if ((long)sums.c * sums.cstep != 0) {
            pvVar16 = bottom_blob->data;
            iVar4 = bottom_blob->w;
            pMVar8 = (Mat *)0x0;
            if ((int)uVar26 < 1) {
              pMVar5 = pMVar8;
            }
            if ((int)uVar10 < 1) {
              pMVar9 = pMVar8;
            }
            sVar2 = bottom_blob->elemsize;
            for (; fVar30 = 0.0, pMVar8 != pMVar9; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
              for (pMVar6 = (Mat *)0x0; pMVar5 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1))
              {
                fVar31 = expf(*(float *)((long)pvVar16 + (long)pMVar6 * 4));
                fVar30 = fVar30 + fVar31;
              }
              *(float *)((long)sums.data + (long)pMVar8 * 4) = fVar30;
              pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * sVar2);
            }
            for (pMVar5 = (Mat *)0x0; pMVar9 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
              fVar30 = fVar30 + *(float *)((long)sums.data + (long)pMVar5 * 4);
            }
            *(float *)top_blob->data = fVar30;
            local_e0 = 0;
          }
        }
        goto LAB_0013bb23;
      }
      uVar26 = bottom_blob->w;
      lVar22 = (long)(int)uVar26;
      uVar10 = bottom_blob->h;
      uVar28 = bottom_blob->c;
      pMVar5 = (Mat *)(ulong)uVar28;
      uVar18 = uVar10 * uVar26;
      in_XMM0._8_4_ = 0xffffffff;
      in_XMM0._0_8_ = 0xffffffffffffffff;
      in_XMM0._12_4_ = 0xffffffff;
      auVar63._0_8_ = SUB168(auVar46 ^ in_XMM0,0) << 0x3f;
      auVar63._8_8_ = SUB168(auVar46 ^ in_XMM0,8) << 0x3f;
      iVar4 = movmskpd(uVar26,auVar63);
      bVar21 = reduce_c ^ 1;
      if (iVar4 == 0 && bVar21 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        pMVar23 = pMVar5;
        Mat::Mat(&sums,uVar28,sVar2,opt->workspace_allocator);
        local_e0 = -100;
        if (sums.data == (void *)0x0) {
LAB_0013ab47:
          local_e0 = -100;
        }
        else if ((long)sums.c * sums.cstep != 0) {
          pMVar8 = (Mat *)0x0;
          pMVar9 = (Mat *)(ulong)uVar18;
          if ((int)uVar18 < 1) {
            pMVar9 = pMVar8;
          }
          if ((int)uVar28 < 1) {
            pMVar5 = pMVar8;
          }
          for (; pMVar8 != pMVar5; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            pMVar23 = bottom_blob;
            Mat::channel(&local_80,bottom_blob,(int)pMVar8);
            pvVar16 = local_80.data;
            Mat::~Mat(&local_80);
            fVar30 = 0.0;
            for (pMVar6 = (Mat *)0x0; pMVar9 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              fVar31 = expf(*(float *)((long)pvVar16 + (long)pMVar6 * 4));
              fVar30 = fVar30 + fVar31;
            }
            *(float *)((long)sums.data + (long)pMVar8 * 4) = fVar30;
          }
          fVar30 = 0.0;
          for (pMVar9 = (Mat *)0x0; pMVar5 != pMVar9; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
            fVar30 = fVar30 + *(float *)((long)sums.data + (long)pMVar9 * 4);
          }
          *(float *)top_blob->data = fVar30;
          local_e0 = 0;
        }
        goto LAB_0013bb23;
      }
      if (iVar4 == 0 && reduce_c == false) {
        pMVar23 = (Mat *)0x1;
        Mat::create(top_blob,1,1,uVar28,sVar2,opt->blob_allocator);
        if ((int)uVar18 < 1) {
          uVar18 = 0;
        }
        in_XMM0 = extraout_XMM0_06;
        uVar26 = 0;
        if ((int)uVar28 < 1) {
          uVar28 = 0;
          uVar26 = 0;
        }
        for (; uVar26 != uVar28; uVar26 = uVar26 + 1) {
          Mat::channel(&sums,bottom_blob,uVar26);
          pvVar16 = sums.data;
          Mat::~Mat(&sums);
          pMVar23 = top_blob;
          Mat::channel(&sums,top_blob,uVar26);
          pvVar17 = sums.data;
          Mat::~Mat(&sums);
          in_XMM0 = (undefined1  [16])0x0;
          for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
            fVar30 = expf(*(float *)((long)pvVar16 + uVar20 * 4));
            in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar30));
          }
          *(float *)pvVar17 = in_XMM0._0_4_;
        }
        goto LAB_0013e894;
      }
      bVar24 = (byte)iVar4 >> 1 | bVar14;
      if (reduce_c == false && (bVar24 & 1) == 0) {
        pMVar23 = (Mat *)0x1;
        Mat::create(top_blob,1,uVar10,uVar28,sVar2,opt->blob_allocator);
        pMVar9 = (Mat *)0x0;
        uVar20 = 0;
        if (0 < (int)uVar26) {
          uVar20 = (ulong)uVar26;
        }
        pMVar8 = (Mat *)(ulong)uVar10;
        if ((int)uVar10 < 1) {
          pMVar8 = pMVar9;
        }
        if ((int)uVar28 < 1) {
          pMVar5 = pMVar9;
        }
        in_XMM0 = extraout_XMM0_09;
        while( true ) {
          local_88 = (int)pMVar5;
          iVar4 = (int)pMVar9;
          if (iVar4 == local_88) break;
          Mat::channel(&sums,bottom_blob,iVar4);
          pvVar16 = sums.data;
          Mat::~Mat(&sums);
          pMVar23 = top_blob;
          Mat::channel(&sums,top_blob,iVar4);
          pvVar17 = sums.data;
          Mat::~Mat(&sums);
          in_XMM0 = extraout_XMM0_10;
          for (pMVar9 = (Mat *)0x0; pMVar9 != pMVar8; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
            in_XMM0 = (undefined1  [16])0x0;
            for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
              fVar30 = expf(*(float *)((long)pvVar16 + uVar25 * 4));
              in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar30));
            }
            *(float *)((long)pvVar17 + (long)pMVar9 * 4) = in_XMM0._0_4_;
            pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
          }
          pMVar9 = (Mat *)(ulong)(iVar4 + 1);
        }
        goto LAB_0013e894;
      }
      if ((bVar24 & 1) == 0 && bVar21 == 0) {
        Mat::create(top_blob,1,uVar10,1,sVar2,opt->blob_allocator);
        pMVar23 = (Mat *)0x1;
        Mat::Mat(&sums,1,uVar10,uVar28,sVar2,opt->workspace_allocator);
        local_e0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          pMVar23 = (Mat *)0x0;
          uVar20 = 0;
          if (0 < (int)uVar26) {
            uVar20 = (ulong)uVar26;
          }
          pMVar9 = (Mat *)(ulong)uVar10;
          if ((int)uVar10 < 1) {
            pMVar9 = pMVar23;
          }
          if ((int)uVar28 < 1) {
            pMVar5 = pMVar23;
          }
          for (; pMVar23 != pMVar5; pMVar23 = (Mat *)((long)&pMVar23->data + 1)) {
            Mat::channel(&local_80,bottom_blob,(int)pMVar23);
            pvVar16 = local_80.data;
            Mat::~Mat(&local_80);
            pvVar17 = (void *)(sums.cstep * (long)pMVar23 * sums.elemsize + (long)sums.data);
            local_80.refcount = (int *)0x0;
            local_80.elemsize = sums.elemsize;
            local_80.elempack = sums.elempack;
            local_80.allocator = sums.allocator;
            local_80.dims = 2;
            local_80.w = sums.w;
            local_80.h = sums.h;
            local_80.c = 1;
            local_80.cstep = (size_t)(sums.h * sums.w);
            local_80.data = pvVar17;
            Mat::~Mat(&local_80);
            for (pMVar8 = (Mat *)0x0; pMVar8 != pMVar9; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
              fVar30 = 0.0;
              for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                fVar31 = expf(*(float *)((long)pvVar16 + uVar25 * 4));
                fVar30 = fVar30 + fVar31;
              }
              *(float *)((long)pvVar17 + (long)pMVar8 * 4) = fVar30;
              pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
            }
          }
          Mat::fill(top_blob,0.0);
          local_e0 = 0;
          pMVar23 = bottom_blob;
          for (pMVar8 = (Mat *)0x0; sVar3 = sums.cstep, sVar2 = sums.elemsize, pvVar16 = sums.data,
              pMVar8 != pMVar5; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            local_80.data = (void *)(sums.cstep * (long)pMVar8 * sums.elemsize + (long)sums.data);
            local_80.refcount = (int *)0x0;
            local_80.elemsize = sums.elemsize;
            local_80.elempack = sums.elempack;
            local_80.allocator = sums.allocator;
            local_80.dims = 2;
            local_80.w = sums.w;
            local_80.h = sums.h;
            local_80.c = 1;
            local_80.cstep = (size_t)(sums.h * sums.w);
            pMVar23 = (Mat *)sums.allocator;
            Mat::~Mat(&local_80);
            pvVar17 = top_blob->data;
            for (pMVar6 = (Mat *)0x0; pMVar9 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
              *(float *)((long)pvVar17 + (long)pMVar6 * 4) =
                   *(float *)((long)pvVar16 + (long)pMVar6 * 4 + sVar3 * sVar2 * (long)pMVar8) +
                   *(float *)((long)pvVar17 + (long)pMVar6 * 4);
            }
          }
        }
      }
      else {
        bVar24 = (byte)iVar4 | bVar15;
        pMVar23 = (Mat *)CONCAT71((int7)(CONCAT44((int)uVar26 >> 0x1f,iVar4) >> 8),bVar24);
        if ((bVar24 & 1) != 0 || bVar21 != 0) {
          if (((bVar14 | bVar15) & 1) == 0 && bVar21 == 0) {
            pMVar23 = (Mat *)(ulong)uVar26;
            Mat::create(top_blob,uVar26,uVar10,1,sVar2,opt->blob_allocator);
            Mat::fill(top_blob,0.0);
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            in_XMM0 = extraout_XMM0_14;
            iVar4 = 0;
            if ((int)uVar28 < 1) {
              pMVar5 = (Mat *)0x0;
              iVar4 = 0;
            }
            for (; iVar4 != (int)pMVar5; iVar4 = iVar4 + 1) {
              pMVar23 = bottom_blob;
              Mat::channel(&sums,bottom_blob,iVar4);
              pvVar17 = sums.data;
              Mat::~Mat(&sums);
              pvVar16 = top_blob->data;
              in_XMM0 = extraout_XMM0_15;
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar30 = expf(*(float *)((long)pvVar17 + uVar20 * 4));
                in_XMM0._0_4_ = fVar30 + *(float *)((long)pvVar16 + uVar20 * 4);
                in_XMM0._4_12_ = extraout_var_03;
                *(float *)((long)pvVar16 + uVar20 * 4) = in_XMM0._0_4_;
              }
            }
          }
          else if (reduce_c == false && (bVar24 & 1) == 0) {
            pMVar23 = (Mat *)(ulong)uVar26;
            Mat::create(top_blob,uVar26,1,uVar28,sVar2,opt->blob_allocator);
            Mat::fill(top_blob,0.0);
            uVar18 = 0;
            uVar20 = 0;
            if (0 < (int)uVar26) {
              uVar20 = (ulong)uVar26;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            in_XMM0 = extraout_XMM0_00;
            for (; uVar18 != uVar28; uVar18 = uVar18 + 1) {
              Mat::channel(&sums,bottom_blob,uVar18);
              pvVar16 = sums.data;
              Mat::~Mat(&sums);
              pMVar23 = top_blob;
              Mat::channel(&sums,top_blob,uVar18);
              pvVar17 = sums.data;
              Mat::~Mat(&sums);
              in_XMM0 = extraout_XMM0_01;
              for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
                for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                  fVar30 = expf(*(float *)((long)pvVar16 + uVar25 * 4));
                  in_XMM0._0_4_ = fVar30 + *(float *)((long)pvVar17 + uVar25 * 4);
                  in_XMM0._4_12_ = extraout_var_00;
                  *(float *)((long)pvVar17 + uVar25 * 4) = in_XMM0._0_4_;
                }
                pvVar16 = (void *)((long)pvVar16 + lVar22 * 4);
              }
            }
          }
          goto LAB_0013e894;
        }
        Mat::create(top_blob,uVar26,1,1,sVar2,opt->blob_allocator);
        pMVar23 = (Mat *)(ulong)uVar26;
        Mat::Mat(&sums,uVar26,1,uVar28,sVar2,opt->workspace_allocator);
        local_e0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          pMVar9 = (Mat *)0x0;
          uVar20 = 0;
          if (0 < (int)uVar26) {
            uVar20 = (ulong)uVar26;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          if ((int)uVar28 < 1) {
            pMVar5 = pMVar9;
          }
          for (; pMVar9 != pMVar5; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
            Mat::channel(&local_80,bottom_blob,(int)pMVar9);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            sVar3 = sums.cstep;
            sVar2 = sums.elemsize;
            pvVar16 = sums.data;
            local_80.data = (void *)(sums.cstep * (long)pMVar9 * sums.elemsize + (long)sums.data);
            local_80.refcount = (int *)0x0;
            local_80.elemsize = sums.elemsize;
            local_80.elempack = sums.elempack;
            local_80.allocator = sums.allocator;
            local_80.dims = 2;
            local_80.w = sums.w;
            local_80.h = sums.h;
            local_80.c = 1;
            local_80.cstep = (size_t)(sums.h * sums.w);
            pMVar23 = (Mat *)sums.allocator;
            Mat::~Mat(&local_80);
            lVar27 = sVar3 * sVar2 * (long)pMVar9;
            for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
              for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                fVar30 = expf(*(float *)((long)pvVar17 + uVar25 * 4));
                *(float *)((long)pvVar16 + uVar25 * 4 + lVar27) =
                     fVar30 + *(float *)((long)pvVar16 + uVar25 * 4 + lVar27);
              }
              pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
            }
          }
          Mat::fill(top_blob,0.0);
          local_e0 = 0;
          for (pMVar9 = (Mat *)0x0; sVar3 = sums.cstep, sVar2 = sums.elemsize, pvVar16 = sums.data,
              pMVar9 != pMVar5; pMVar9 = (Mat *)((long)&pMVar9->data + 1)) {
            local_80.data = (void *)(sums.cstep * (long)pMVar9 * sums.elemsize + (long)sums.data);
            local_80.refcount = (int *)0x0;
            local_80.elemsize = sums.elemsize;
            local_80.elempack = sums.elempack;
            local_80.allocator = sums.allocator;
            local_80.dims = 2;
            local_80.w = sums.w;
            local_80.h = sums.h;
            local_80.c = 1;
            local_80.cstep = (size_t)(sums.h * sums.w);
            pMVar23 = (Mat *)sums.allocator;
            Mat::~Mat(&local_80);
            pvVar17 = top_blob->data;
            for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
              *(float *)((long)pvVar17 + uVar25 * 4) =
                   *(float *)((long)pvVar16 + uVar25 * 4 + sVar3 * sVar2 * (long)pMVar9) +
                   *(float *)((long)pvVar17 + uVar25 * 4);
            }
          }
        }
      }
LAB_0013eca7:
      Mat::~Mat(&sums);
      in_XMM0 = extraout_XMM0_18;
    }
    if (local_e0 != 0) {
      return -100;
    }
LAB_0013e894:
    reduction_post_process<ncnn::post_process_log<float>>(top_blob,in_XMM0._0_4_,(Option *)pMVar23);
    return 0;
  }
  return -100;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[3] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i=0; i<reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims + 1;
            axes_flag[axis - 1] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
    }

    if (operation == ReductionOp_SUM)
        return reduction< std::plus<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_ASUM)
        return reduction< reduction_op_asum<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction< reduction_op_sumsq<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MEAN)
    {
        int scale = 1;
        int dims = bottom_blob.dims;
        if (dims == 1)
        {
            scale = bottom_blob.w;
        }
        else if (dims == 2)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
        }
        else if (dims == 3)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_c) scale *= bottom_blob.c;
        }

        float coeff_mean = coeff / scale;
        return reduction< std::plus<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, coeff_mean, keepdims, opt);
    }

    if (operation == ReductionOp_MAX)
        return reduction< reduction_op_max<float>, reduction_op_max<float>, post_process_identity<float> >(bottom_blob, top_blob, -FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MIN)
        return reduction< reduction_op_min<float>, reduction_op_min<float>, post_process_identity<float> >(bottom_blob, top_blob, FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_PROD)
        return reduction< std::multiplies<float>, std::multiplies<float>, post_process_identity<float> >(bottom_blob, top_blob, 1.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);
    
    if (operation == ReductionOp_L1)
        return reduction< reduction_op_asum<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, 1.f, keepdims, opt);

    if (operation == ReductionOp_L2)
        return reduction< reduction_op_sumsq<float>, std::plus<float>, post_process_sqrt<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);
    
    if (operation == ReductionOp_LogSum)
        return reduction< std::plus<float>, std::plus<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);
    
    if (operation == ReductionOp_LogSumExp)
        return reduction< reduction_op_sumsexp<float>, std::plus<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);

    return 0;
}